

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O1

char * google::protobuf::internal::TcParser::FastEndGroupImpl<unsigned_short>
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  byte bVar1;
  char cVar2;
  uint32_t uVar3;
  int iVar4;
  uint32_t uVar5;
  uint32_t *puVar6;
  undefined8 uVar7;
  anon_class_24_3_6b4a22af f;
  anon_class_24_3_6b4a22af f_00;
  anon_class_24_3_6b4a22af f_01;
  anon_class_24_3_6b4a22af f_02;
  bool bVar8;
  ushort uVar9;
  int iVar10;
  uint uVar11;
  FieldEntry *pFVar12;
  char *pcVar13;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 in_RAX;
  undefined7 extraout_var;
  TailCallParseFunc UNRECOVERED_JUMPTABLE_01;
  long lVar14;
  RepeatedField<unsigned_long> *this;
  ushort *puVar15;
  RepeatedField<unsigned_int> *this_00;
  undefined7 extraout_var_00;
  string *psVar16;
  undefined7 extraout_var_01;
  MessageLite *pMVar17;
  char *pcVar18;
  TcParseTableBase *pTVar19;
  void *pvVar20;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aVar21;
  ParseContext *ctx_00;
  uint *puVar22;
  ulong uVar23;
  Nonnull<const_char_*> pcVar24;
  uint uVar25;
  code *UNRECOVERED_JUMPTABLE_00;
  TcFieldData TVar26;
  code *arena;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aVar27;
  ParseContext *extraout_RDX;
  ParseContext *extraout_RDX_00;
  FieldEntry *extraout_RDX_01;
  FieldEntry *entry;
  undefined8 extraout_RDX_02;
  ParseContext *extraout_RDX_03;
  ParseContext *extraout_RDX_04;
  ParseContext *extraout_RDX_05;
  ParseContext *extraout_RDX_06;
  ParseContext *extraout_RDX_07;
  ParseContext *extraout_RDX_08;
  ParseContext *extraout_RDX_09;
  ParseContext *extraout_RDX_10;
  ParseContext *extraout_RDX_11;
  ParseContext *extraout_RDX_12;
  ParseContext *extraout_RDX_13;
  long *plVar28;
  undefined8 extraout_RDX_14;
  ParseContext *extraout_RDX_15;
  ParseContext *extraout_RDX_16;
  ParseContext *pPVar29;
  ParseContext *extraout_RDX_17;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aVar30;
  ParseContext *extraout_RDX_18;
  ushort uVar31;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 *paVar32;
  undefined4 *puVar33;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aVar34;
  uint uVar35;
  uint7 uVar37;
  uint64_t *puVar36;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aVar38;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 ptr_00;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aVar39;
  Arena *pAVar40;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aVar41;
  undefined8 *puVar42;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aVar43;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aVar44;
  uint16_t uVar45;
  uint uVar46;
  ushort uVar47;
  int iVar48;
  FieldEntry *pFVar49;
  long lVar50;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aVar51;
  undefined4 uVar52;
  string_view sVar53;
  pair<const_char_*,_int> pVar54;
  pair<const_char_*,_int> pVar55;
  string_view sVar56;
  pair<const_char_*,_int> pVar57;
  pair<const_char_*,_int> pVar58;
  string_view data_00;
  string_view wire_bytes;
  string_view wire_bytes_00;
  string_view wire_bytes_01;
  byte bStack_a9;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aStack_88;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aStack_80;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aStack_78;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aStack_70;
  undefined1 auStack_68 [8];
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aStack_60;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aStack_58;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aStack_50;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aStack_48;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aStack_40;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aStack_38;
  
  uVar11 = (uint)hasbits;
  if (data.field_0._0_2_ == 0) {
    (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = (data.field_0._2_4_ & 0xffff) - 1;
    if ((ulong)table->has_bits_offset != 0) {
      puVar22 = (uint *)((long)&msg->_vptr_MessageLite + (ulong)table->has_bits_offset);
      if (((ulong)puVar22 & 3) != 0) {
        AlignFail();
      }
      *puVar22 = *puVar22 | uVar11;
    }
    return ptr + 2;
  }
  bVar1 = *ptr;
  uVar35 = (uint)bVar1;
  aVar30.data = (long)ptr + 1U;
  if ((char)bVar1 < '\0') {
    uVar37 = (uint7)(((ulong)bVar1 << 0x39) >> 8);
    cVar2 = *(char *)((long)ptr + 1U);
    lVar14 = CONCAT71(uVar37,cVar2);
    if (cVar2 < '\0') {
      uVar37 = uVar37 >> 7 | (uint7)((ulong)(lVar14 << 0x39) >> 8);
      lVar14 = CONCAT71(uVar37,ptr[2]);
      if (ptr[2] < '\0') {
        uVar37 = uVar37 >> 7 | (uint7)((ulong)(lVar14 << 0x39) >> 8);
        lVar14 = CONCAT71(uVar37,ptr[3]);
        if (ptr[3] < '\0') {
          uVar37 = uVar37 >> 7 | (uint7)((ulong)(lVar14 << 0x39) >> 8);
          if (ptr[4] < '\0') {
            uVar35 = 0;
            aVar30.data = 0;
          }
          else {
            uVar35 = (int)CONCAT71(uVar37,ptr[4]) << 0x1c | (uint)(uVar37 >> 0x1c);
            ptr = (char *)((long)ptr + 5);
            aVar30.data = (uint64_t)ptr;
          }
        }
        else {
          uVar35 = (int)lVar14 << 0x15 | (uint)(uVar37 >> 0x23);
          ptr = (char *)((long)ptr + 4);
          aVar30.data = (uint64_t)ptr;
        }
      }
      else {
        uVar35 = (int)lVar14 << 0xe | (uint)(uVar37 >> 0x2a);
        ptr = (char *)((long)ptr + 3);
        aVar30.data = (uint64_t)ptr;
      }
    }
    else {
      uVar35 = (int)lVar14 << 7 | (uint)(((ulong)bVar1 << 0x39) >> 0x39);
      ptr = (char *)((long)ptr + 2);
      aVar30.data = (uint64_t)ptr;
    }
  }
  if ((EpsCopyInputStream *)aVar30.data == (EpsCopyInputStream *)0x0) {
    pcVar13 = Error(msg,ptr,ctx,data,table,hasbits);
    return pcVar13;
  }
  aStack_40.data = 0x27c003;
  aStack_38 = in_RAX;
  pFVar12 = FindFieldEntry(table,uVar35 >> 3);
  if (pFVar12 == (FieldEntry *)0x0) {
    TVar26.field_0.data._4_4_ = 0;
    TVar26.field_0.data._0_4_ = uVar35;
    pcVar13 = (*table->fallback)(msg,(char *)aVar30,ctx,TVar26,table,hasbits);
    return pcVar13;
  }
  aVar38._0_4_ = (int)pFVar12 - (int)table;
  UNRECOVERED_JUMPTABLE_00._4_4_ = aVar38._0_4_;
  UNRECOVERED_JUMPTABLE_00._0_4_ = uVar35;
  aVar44 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)table;
  switch(pFVar12->type_card & 0xf) {
  case 0:
    pcVar13 = (*table->fallback)(msg,(char *)aVar30,ctx,(TcFieldData)UNRECOVERED_JUMPTABLE_00,table,
                                 hasbits);
    return pcVar13;
  case 1:
    pFVar12 = (FieldEntry *)((long)&table->has_bits_offset + (ulong)aVar38._0_4_);
    if (((ulong)pFVar12 & 3) != 0) {
      aStack_80.data = 0x288a74;
      AlignFail(pFVar12);
    }
    uVar47 = pFVar12->type_card;
    uVar11 = uVar47 & 0x30;
    if (uVar11 == 0x20) {
      pcVar13 = MpRepeatedVarint<false>
                          (msg,(char *)aVar30,ctx,(TcFieldData)UNRECOVERED_JUMPTABLE_00,table,
                           hasbits);
      return pcVar13;
    }
    if ((uVar35 & 7) != 0) {
      UNRECOVERED_JUMPTABLE_01 = table->fallback;
      goto LAB_002887f5;
    }
    aVar44 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)(long)*(char *)aVar30;
    pPVar29 = ctx;
    if ((long)aVar44.data < 0) {
      ptr_00.data = 0xffffffffffffff80;
      aVar41.data = (long)*(char *)(aVar30.data + 1) << 7 | 0x7f;
      if ((long)aVar41 < 0) {
        pPVar29 = (ParseContext *)((long)*(char *)(aVar30.data + 2) << 0xe | 0x3fff);
        if ((long)pPVar29 < 0) {
          aVar41.data = aVar41.data & ((long)*(char *)(aVar30.data + 3) << 0x15 | 0x1fffffU);
          if ((long)aVar41 < 0) {
            pPVar29 = (ParseContext *)
                      ((ulong)pPVar29 & ((long)*(char *)(aVar30.data + 4) << 0x1c | 0xfffffffU));
            if ((long)pPVar29 < 0) {
              aVar41.data = aVar41.data & ((long)*(char *)(aVar30.data + 5) << 0x23 | 0x7ffffffffU);
              if ((long)aVar41 < 0) {
                pPVar29 = (ParseContext *)
                          ((ulong)pPVar29 &
                          ((long)*(char *)(aVar30.data + 6) << 0x2a | 0x3ffffffffffU));
                if ((long)pPVar29 < 0) {
                  aVar41.data = aVar41.data &
                                ((long)*(char *)(aVar30.data + 7) << 0x31 | 0x1ffffffffffffU);
                  if ((long)aVar41 < 0) {
                    pPVar29 = (ParseContext *)
                              ((ulong)pPVar29 &
                              ((ulong)*(byte *)(aVar30.data + 8) << 0x38 | 0xffffffffffffff));
                    if ((long)pPVar29 < 0) {
                      aVar51.data = aVar30.data + 10;
                      if (*(char *)(aVar30.data + 9) != '\x01') {
                        bVar1 = *(byte *)(aVar30.data + 9);
                        ptr_00.data._1_7_ = 0xffffffffffffff;
                        ptr_00.data._0_1_ = bVar1;
                        if ((char)bVar1 < '\0') {
                          aVar51.data = 0;
                          goto LAB_00288819;
                        }
                        if ((bVar1 & 1) == 0) {
                          pPVar29 = (ParseContext *)((ulong)pPVar29 ^ 0x8000000000000000);
                        }
                      }
                    }
                    else {
                      aVar51.data = aVar30.data + 9;
                    }
                  }
                  else {
                    aVar51.data = aVar30.data + 8;
                  }
                }
                else {
                  aVar51.data = aVar30.data + 7;
                }
              }
              else {
                aVar51.data = aVar30.data + 6;
              }
            }
            else {
              aVar51.data = aVar30.data + 5;
            }
          }
          else {
            aVar51.data = aVar30.data + 4;
          }
        }
        else {
          aVar51.data = aVar30.data + 3;
        }
        aVar41.data = aVar41.data & (ulong)pPVar29;
      }
      else {
        aVar51.data = aVar30.data + 2;
      }
      aVar44.data = aVar44.data & aVar41.data;
    }
    else {
      aVar51.data = aVar30.data + 1;
      aVar41 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)UNRECOVERED_JUMPTABLE_00;
      ptr_00 = aVar30;
    }
LAB_00288819:
    if ((EpsCopyInputStream *)aVar51.data == (EpsCopyInputStream *)0x0) {
      pcVar13 = Error(msg,(char *)ptr_00,pPVar29,(TcFieldData)aVar41,table,hasbits);
      return pcVar13;
    }
    uVar25 = uVar47 & 0x600;
    pPVar29 = (ParseContext *)(ulong)uVar25;
    aVar38._0_4_ = uVar47 & 0x1c0;
    aVar38.data._4_4_ = 0;
    uVar46 = (uint)aVar44.data;
    aVar41 = aVar38;
    if ((EpsCopyInputStream *)aVar38.data == (EpsCopyInputStream *)0xc0) {
      if (uVar25 == 0x200) {
        aVar44.data = -(ulong)(uVar46 & 1) ^ aVar44.data >> 1;
      }
    }
    else if (aVar38._0_4_ == 0x80) {
      if ((uVar47 >> 10 & 1) == 0) {
        if (uVar25 == 0x200) {
          aVar44 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
                   (long)(int)(-(uVar46 & 1) ^ (uint)(aVar44.data >> 1) & 0x7fffffff);
        }
      }
      else {
        aStack_70.data = (ulong)CONCAT24(uVar47,aStack_70._0_4_) & 0x1c0ffffffff;
        puVar6 = *(uint32_t **)
                  ((long)&table->has_bits_offset +
                  (ulong)pFVar12->aux_idx * 8 + (ulong)table->aux_offset);
        aStack_58 = aVar38;
        if (uVar25 == 0x600) {
          bVar8 = (int)puVar6 <= (int)uVar46;
          pPVar29 = (ParseContext *)(ulong)CONCAT31(6,bVar8);
          bVar8 = (int)uVar46 <= (int)((ulong)puVar6 >> 0x20) && bVar8;
        }
        else {
          aStack_80.data = 0x2888fd;
          auStack_68 = (undefined1  [8])hasbits;
          aStack_60 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)ctx;
          aStack_50 = aVar51;
          aStack_48 = aVar44;
          bVar8 = ValidateEnum(uVar46,puVar6);
          ctx = (ParseContext *)aStack_60;
          hasbits = (uint64_t)auStack_68;
          aVar44 = aStack_48;
          aVar51 = aStack_50;
        }
        aVar38._0_4_ = (uint)((ulong)aStack_70 >> 0x20);
        aVar41 = aStack_58;
        if (bVar8 == false) {
          pcVar13 = MpUnknownEnumFallback
                              (msg,(char *)aVar30,ctx,(TcFieldData)UNRECOVERED_JUMPTABLE_00,table,
                               hasbits);
          return pcVar13;
        }
      }
    }
    aVar30 = aVar51;
    if (uVar11 == 0x30) {
      aStack_70.data._4_4_ = aVar38._0_4_;
      aStack_80.data = 0x28897a;
      aStack_60 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)ctx;
      aStack_58 = aVar41;
      ChangeOneof(table,pFVar12,uVar35 >> 3,pPVar29,msg);
      aVar38._0_4_ = (uint)((ulong)aStack_70 >> 0x20);
      aVar41 = aStack_58;
      ctx = (ParseContext *)aStack_60;
    }
    else if (uVar11 == 0x10) {
      puVar22 = (uint *)((long)&msg->_vptr_MessageLite + (ulong)((uint)pFVar12->has_idx >> 5) * 4);
      if (((ulong)puVar22 & 3) != 0) goto LAB_00288acc;
      *puVar22 = *puVar22 | 1 << ((byte)pFVar12->has_idx & 0x1f);
    }
    if (aVar38._0_4_ == 0xc0) {
      paVar32 = (anon_union_8_1_898a9ca8_for_TcFieldData_0 *)
                ((long)&msg->_vptr_MessageLite + (ulong)pFVar12->offset);
      if (((ulong)paVar32 & 7) != 0) {
        aStack_80.data = 0x288ad6;
        AlignFail();
      }
      paVar32->data = (uint64_t)aVar44;
    }
    else if (aVar38._0_4_ == 0x80) {
      puVar33 = (undefined4 *)((long)&msg->_vptr_MessageLite + (ulong)pFVar12->offset);
      if (((ulong)puVar33 & 3) != 0) {
LAB_00288acc:
        aStack_80.data = 0x288ad1;
        AlignFail();
      }
      *puVar33 = (int)aVar44.data;
    }
    else {
      if (aVar38._0_4_ == 0) {
        pcVar24 = (Nonnull<const_char_*>)0x0;
      }
      else {
        aStack_80.data = 0x288afd;
        auStack_68 = (undefined1  [8])hasbits;
        pcVar24 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                            (aVar41.data,0,"rep == static_cast<uint16_t>(field_layout::kRep8Bits)");
        hasbits = (uint64_t)auStack_68;
      }
      if (pcVar24 != (Nonnull<const_char_*>)0x0) {
        aStack_80.data = 0x288bbc;
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&aStack_40,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc"
                   ,0x829,pcVar24);
        aStack_80.data = 0x288bc4;
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&aStack_40);
      }
      *(bool *)((long)&msg->_vptr_MessageLite + (ulong)pFVar12->offset) =
           (EpsCopyInputStream *)aVar44.data != (EpsCopyInputStream *)0x0;
    }
    if (*(EpsCopyInputStream **)ctx <= aVar30.data) {
      if ((ulong)table->has_bits_offset != 0) {
        puVar22 = (uint *)((long)&msg->_vptr_MessageLite + (ulong)table->has_bits_offset);
        if (((ulong)puVar22 & 3) != 0) {
          aStack_80.data = 0x288ade;
          AlignFail(puVar22);
        }
        *puVar22 = *puVar22 | (uint)hasbits;
      }
      return (char *)aVar30.data;
    }
    uVar11 = (uint)table->fast_idx_mask & (uint)*(ushort *)aVar30;
    if ((uVar11 & 7) != 0) {
      aStack_80.data = 0x288b28;
      protobuf_assumption_failed
                ("(idx & 7) == 0",
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_impl.h"
                 ,0x452);
    }
    uVar23 = (ulong)(uVar11 & 0xfffffff8);
    UNRECOVERED_JUMPTABLE_00 =
         (code *)((ulong)*(ushort *)aVar30 ^ *(ulong *)(&table[1].fast_idx_mask + uVar23 * 2));
    UNRECOVERED_JUMPTABLE_01 = *(TailCallParseFunc *)(&table[1].has_bits_offset + uVar23);
LAB_002887f5:
    pcVar13 = (*UNRECOVERED_JUMPTABLE_01)
                        (msg,(char *)aVar30,ctx,(TcFieldData)UNRECOVERED_JUMPTABLE_00,table,hasbits)
    ;
    return pcVar13;
  case 2:
    uVar23 = (long)&table->has_bits_offset + (ulong)aVar38._0_4_;
    if ((uVar23 & 3) != 0) {
      aStack_50 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x288dd0;
      AlignFail();
    }
    if ((uVar35 & 7) != 2) {
      pcVar13 = MpRepeatedVarint<false>
                          (msg,(char *)aVar30,ctx,(TcFieldData)UNRECOVERED_JUMPTABLE_00,table,
                           hasbits);
      return pcVar13;
    }
    uVar47 = *(ushort *)(uVar23 + 10);
    if ((ulong)table->has_bits_offset != 0) {
      puVar22 = (uint *)((long)&msg->_vptr_MessageLite + (ulong)table->has_bits_offset);
      if (((ulong)puVar22 & 3) != 0) {
        aStack_50 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x288dd8;
        AlignFail(puVar22);
      }
      *puVar22 = *puVar22 | uVar11;
    }
    uVar31 = uVar47 >> 6;
    uVar9 = uVar31 & 7;
    if ((uVar31 & 7) == 0) {
      pcVar13 = MpPackedVarintT<false,bool,(unsigned_short)0>
                          (msg,(char *)aVar30,ctx,(TcFieldData)UNRECOVERED_JUMPTABLE_00,table,
                           hasbits);
      return pcVar13;
    }
    uVar11 = uVar47 & 0x600;
    if (uVar9 == 2) {
      switch(uVar11) {
      default:
        pcVar13 = MpPackedVarintT<false,unsigned_int,(unsigned_short)0>
                            (msg,(char *)aVar30,ctx,(TcFieldData)UNRECOVERED_JUMPTABLE_00,table,
                             hasbits);
        return pcVar13;
      case 0x200:
      case 0x220:
      case 0x240:
      case 0x260:
      case 0x280:
      case 0x2a0:
      case 0x2c0:
      case 0x2e0:
      case 0x300:
      case 800:
      case 0x340:
      case 0x360:
      case 0x380:
      case 0x3a0:
      case 0x3c0:
      case 0x3e0:
        pcVar13 = MpPackedVarintT<false,unsigned_int,(unsigned_short)512>
                            (msg,(char *)aVar30,ctx,(TcFieldData)UNRECOVERED_JUMPTABLE_00,table,
                             hasbits);
        return pcVar13;
      case 0x400:
      case 0x420:
      case 0x440:
      case 0x460:
      case 0x480:
      case 0x4a0:
      case 0x4c0:
      case 0x4e0:
      case 0x500:
      case 0x520:
      case 0x540:
      case 0x560:
      case 0x580:
      case 0x5a0:
      case 0x5c0:
      case 0x5e0:
        pcVar13 = MpPackedVarintT<false,unsigned_int,(unsigned_short)1024>
                            (msg,(char *)aVar30,ctx,(TcFieldData)UNRECOVERED_JUMPTABLE_00,table,
                             hasbits);
        return pcVar13;
      case 0x600:
      case 0x620:
      case 0x640:
      case 0x660:
      case 0x680:
      case 0x6a0:
      case 0x6c0:
      case 0x6e0:
      case 0x700:
      case 0x720:
      case 0x740:
      case 0x760:
      case 0x780:
      case 0x7a0:
      case 0x7c0:
      case 0x7e0:
        pcVar13 = MpPackedVarintT<false,unsigned_int,(unsigned_short)1536>
                            (msg,(char *)aVar30,ctx,(TcFieldData)UNRECOVERED_JUMPTABLE_00,table,
                             hasbits);
        return pcVar13;
      }
    }
    if (uVar9 != 3) {
      aStack_50 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x288dff;
      Unreachable("/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc"
                  ,0x8f9);
    }
    if ((short)uVar11 == 0) {
      pcVar13 = MpPackedVarintT<false,unsigned_long,(unsigned_short)0>
                          (msg,(char *)aVar30,ctx,(TcFieldData)UNRECOVERED_JUMPTABLE_00,table,
                           hasbits);
      return pcVar13;
    }
    if (uVar11 == 0x200) {
      pcVar24 = (Nonnull<const_char_*>)0x0;
    }
    else {
      aStack_50.data = 0x288de9;
      pcVar24 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                          ((ulong)uVar11,0x200,"xform_val == +field_layout::kTvZigZag");
    }
    if (pcVar24 != (Nonnull<const_char_*>)0x0) {
      aStack_50 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x288e1b;
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&aStack_40,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc"
                 ,0x8db,pcVar24);
      aStack_50 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)&UNK_00288e23;
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&aStack_40);
    }
    pcVar13 = MpPackedVarintT<false,unsigned_long,(unsigned_short)512>
                        (msg,(char *)aVar30,ctx,(TcFieldData)UNRECOVERED_JUMPTABLE_00,table,hasbits)
    ;
    return pcVar13;
  case 3:
    pFVar12 = (FieldEntry *)((long)&table->has_bits_offset + (ulong)aVar38._0_4_);
    if (((ulong)pFVar12 & 3) != 0) {
      aStack_70 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x288fc9;
      AlignFail(pFVar12);
    }
    uVar47 = pFVar12->type_card & 0x30;
    if (uVar47 == 0x20) {
      pcVar13 = MpRepeatedFixed<false>
                          (msg,(char *)aVar30,ctx,(TcFieldData)UNRECOVERED_JUMPTABLE_00,table,
                           hasbits);
      return pcVar13;
    }
    uVar11 = pFVar12->type_card & 0x1c0;
    aVar44 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)UNRECOVERED_JUMPTABLE_00;
    if ((ulong)uVar11 == 0xc0) {
      if ((uVar35 & 7) != 1) {
LAB_00288ee7:
        UNRECOVERED_JUMPTABLE_01 = table->fallback;
        goto LAB_00288f87;
      }
    }
    else {
      if (uVar11 == 0x80) {
        pcVar24 = (Nonnull<const_char_*>)0x0;
      }
      else {
        aStack_70.data = 0x288ff1;
        aStack_60 = aVar30;
        aStack_58 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)ctx;
        aStack_50 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)msg;
        aStack_48.data = hasbits;
        pcVar24 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                            ((ulong)uVar11,0x80,
                             "rep == static_cast<uint16_t>(field_layout::kRep32Bits)");
        ctx = (ParseContext *)aStack_58;
        aVar30 = aStack_60;
        msg = (MessageLite *)aStack_50;
        hasbits = aStack_48.data;
      }
      if (pcVar24 != (Nonnull<const_char_*>)0x0) {
        aStack_70 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x289038;
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&aStack_40,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc"
                   ,0x77f,pcVar24);
        aStack_70 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x289040;
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&aStack_40);
      }
      if ((uVar35 & 7) != 5) goto LAB_00288ee7;
    }
    if (uVar47 == 0x30) {
      aStack_70.data = 0x288f14;
      aStack_60 = aVar30;
      ChangeOneof(table,pFVar12,uVar35 >> 3,(ParseContext *)aVar44,msg);
      aVar30 = aStack_60;
    }
    else if (uVar47 == 0x10) {
      puVar22 = (uint *)((long)msg + (ulong)((uint)pFVar12->has_idx >> 5) * 4);
      if (((ulong)puVar22 & 3) != 0) goto LAB_0028900a;
      *puVar22 = *puVar22 | 1 << ((byte)pFVar12->has_idx & 0x1f);
    }
    puVar42 = (undefined8 *)((ulong)pFVar12->offset + (long)msg);
    if (uVar11 == 0xc0) {
      if (((ulong)puVar42 & 7) != 0) {
        aStack_70 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x289014;
        AlignFail();
      }
      *puVar42 = *(undefined8 *)aVar30;
      lVar14 = 8;
    }
    else {
      if (((ulong)puVar42 & 3) != 0) {
LAB_0028900a:
        aStack_70 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x28900f;
        AlignFail();
      }
      *(undefined4 *)puVar42 = *(undefined4 *)aVar30;
      lVar14 = 4;
    }
    aVar30.data = aVar30.data + lVar14;
    if (*(EpsCopyInputStream **)ctx <= aVar30.data) {
      if ((ulong)table->has_bits_offset != 0) {
        puVar22 = (uint *)((long)msg + (ulong)table->has_bits_offset);
        if (((ulong)puVar22 & 3) != 0) {
          aStack_70 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x28901c;
          AlignFail(puVar22);
        }
        *puVar22 = *puVar22 | (uint)hasbits;
      }
      return (char *)aVar30.data;
    }
    uVar11 = (uint)table->fast_idx_mask & (uint)*(ushort *)aVar30;
    if ((uVar11 & 7) != 0) {
      aStack_70.data = (uint64_t)MpPackedFixed<false>;
      protobuf_assumption_failed
                ("(idx & 7) == 0",
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_impl.h"
                 ,0x452);
    }
    uVar23 = (ulong)(uVar11 & 0xfffffff8);
    UNRECOVERED_JUMPTABLE_00 =
         (code *)((ulong)*(ushort *)aVar30 ^ *(ulong *)(&table[1].fast_idx_mask + uVar23 * 2));
    UNRECOVERED_JUMPTABLE_01 = *(TailCallParseFunc *)(&table[1].has_bits_offset + uVar23);
LAB_00288f87:
    pcVar13 = (*UNRECOVERED_JUMPTABLE_01)
                        (msg,(char *)aVar30,ctx,(TcFieldData)UNRECOVERED_JUMPTABLE_00,table,hasbits)
    ;
    return pcVar13;
  case 4:
    puVar22 = (uint *)((long)&table->has_bits_offset + (ulong)aVar38._0_4_);
    if (((ulong)puVar22 & 3) != 0) {
      aStack_60 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x2891ba;
      AlignFail(puVar22);
    }
    if ((uVar35 & 7) != 2) {
      pcVar13 = MpRepeatedFixed<false>
                          (msg,(char *)aVar30,ctx,(TcFieldData)UNRECOVERED_JUMPTABLE_00,table,
                           hasbits);
      return pcVar13;
    }
    uVar47 = *(ushort *)((long)puVar22 + 10);
    bVar1 = *(byte *)aVar30;
    uVar11 = (uint)bVar1;
    if ((char)bVar1 < '\0') {
      aStack_60 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x2890d0;
      aStack_50 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)msg;
      aStack_48.data = hasbits;
      pVar57 = ReadSizeFallback((char *)aVar30,(uint)bVar1);
      pcVar13 = pVar57.first;
      uVar11 = pVar57.second;
    }
    else {
      pcVar13 = (char *)(aVar30.data + 1);
      aStack_50 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)msg;
      aStack_48.data = hasbits;
    }
    aVar30 = aStack_50;
    uVar35 = uVar47 & 0x1c0;
    if ((ulong)uVar35 == 0xc0) {
      aVar44.data = (long)(_func_int ***)aStack_50 + (ulong)*puVar22;
      if ((aVar44.data & 7) != 0) {
LAB_002891ba:
        aStack_60 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x2891c2;
        AlignFail(aVar44.data);
      }
      aStack_60 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x289106;
      puVar15 = (ushort *)
                EpsCopyInputStream::ReadPackedFixed<unsigned_long>
                          (&ctx->super_EpsCopyInputStream,pcVar13,uVar11,
                           (RepeatedField<unsigned_long> *)aVar44);
      pPVar29 = extraout_RDX;
    }
    else {
      if (uVar35 == 0x80) {
        pcVar24 = (Nonnull<const_char_*>)0x0;
      }
      else {
        aStack_60 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x2891ef;
        pcVar24 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                            ((ulong)uVar35,0x80,
                             "rep == static_cast<uint16_t>(field_layout::kRep32Bits)");
      }
      aVar30 = aStack_50;
      if (pcVar24 != (Nonnull<const_char_*>)0x0) {
        aStack_60 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x289218;
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&aStack_40,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc"
                   ,0x7e4,pcVar24);
        aStack_60 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x289220;
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&aStack_40);
      }
      aVar44.data = (long)(_func_int ***)aStack_50 + (ulong)*puVar22;
      if ((aVar44.data & 7) != 0) goto LAB_002891ba;
      aStack_60 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x289141;
      puVar15 = (ushort *)
                EpsCopyInputStream::ReadPackedFixed<unsigned_int>
                          (&ctx->super_EpsCopyInputStream,pcVar13,uVar11,
                           (RepeatedField<unsigned_int> *)aVar44);
      pPVar29 = extraout_RDX_00;
    }
    if (puVar15 == (ushort *)0x0) {
      pcVar13 = Error((MessageLite *)aVar30,pcVar13,pPVar29,(TcFieldData)aVar44,table,aStack_48.data
                     );
      return pcVar13;
    }
    if ((ctx->super_EpsCopyInputStream).limit_end_ <= puVar15) {
      if ((ulong)table->has_bits_offset != 0) {
        puVar22 = (uint *)((long)&((MessageLite *)aVar30.data)->_vptr_MessageLite +
                          (ulong)table->has_bits_offset);
        if (((ulong)puVar22 & 3) != 0) {
          aStack_60 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x2891fc;
          AlignFail(puVar22);
        }
        *puVar22 = *puVar22 | (uint)aStack_48.data;
      }
      return (char *)puVar15;
    }
    uVar11 = (uint)table->fast_idx_mask & (uint)*puVar15;
    if ((uVar11 & 7) != 0) {
      aStack_60.data = (uint64_t)MpString<false>;
      protobuf_assumption_failed
                ("(idx & 7) == 0",
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_impl.h"
                 ,0x452);
    }
    uVar23 = (ulong)(uVar11 & 0xfffffff8);
    pcVar13 = (char *)(**(code **)(&table[1].has_bits_offset + uVar23))
                                (aVar30.data,puVar15,ctx,
                                 (ulong)*puVar15 ^ *(ulong *)(&table[1].fast_idx_mask + uVar23 * 2),
                                 table);
    return pcVar13;
  case 6:
    pFVar49 = (FieldEntry *)((long)&table->has_bits_offset + (ulong)aVar38._0_4_);
    pFVar12 = pFVar49;
    if (((ulong)pFVar49 & 3) != 0) {
LAB_0028999d:
      aStack_60 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x2899a2;
      AlignFail(pFVar12);
    }
    uVar47 = pFVar49->type_card;
    uVar31 = uVar47 & 0x30;
    if (uVar31 == 0x20) {
      if ((uVar47 & 0x1c0) == 0x40) {
        pcVar13 = MpRepeatedMessageOrGroup<false,true>
                            (msg,(char *)aVar30,ctx,(TcFieldData)UNRECOVERED_JUMPTABLE_00,table,
                             hasbits);
        return pcVar13;
      }
      if ((uVar47 & 0x1c0) == 0) {
        pcVar13 = MpRepeatedMessageOrGroup<false,false>
                            (msg,(char *)aVar30,ctx,(TcFieldData)UNRECOVERED_JUMPTABLE_00,table,
                             hasbits);
        return pcVar13;
      }
LAB_00289763:
      pcVar13 = (*table->fallback)(msg,(char *)aVar30,ctx,(TcFieldData)UNRECOVERED_JUMPTABLE_00,
                                   table,hasbits);
      return pcVar13;
    }
    aVar38._0_4_ = uVar35 & 7;
    if ((uVar47 & 0x1c0) == 0x40) {
      if (aVar38._0_4_ != 3) goto LAB_00289763;
    }
    else if (((uVar47 & 0x1c0) != 0) || (aVar38._0_4_ != 2)) goto LAB_00289763;
    if (uVar31 == 0x30) {
      aStack_60 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x2897a4;
      aStack_58 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)ctx;
      aStack_50 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)UNRECOVERED_JUMPTABLE_00;
      aStack_48 = aVar30;
      bVar8 = ChangeOneof(table,pFVar49,uVar35 >> 3,(ParseContext *)(ulong)aVar38._0_4_,msg);
      uVar23 = CONCAT71(extraout_var,bVar8);
      UNRECOVERED_JUMPTABLE_00 = (code *)aStack_50;
      aVar30 = aStack_48;
    }
    else {
      if (uVar31 == 0x10) {
        pFVar12 = (FieldEntry *)
                  ((long)&msg->_vptr_MessageLite + (ulong)((uint)pFVar49->has_idx >> 5) * 4);
        aStack_58 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)ctx;
        if (((ulong)pFVar12 & 3) != 0) goto LAB_0028999d;
        pFVar12->offset = pFVar12->offset | 1 << ((byte)pFVar49->has_idx & 0x1f);
      }
      uVar23 = 0;
      aStack_58 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)ctx;
    }
    if ((ulong)table->has_bits_offset != 0) {
      pFVar12 = (FieldEntry *)((long)&msg->_vptr_MessageLite + (ulong)table->has_bits_offset);
      if (((ulong)pFVar12 & 3) != 0) goto LAB_0028999d;
      pFVar12->offset = pFVar12->offset | uVar11;
    }
    plVar28 = (long *)((long)&msg->_vptr_MessageLite + (ulong)pFVar49->offset);
    if (((ulong)plVar28 & 7) != 0) {
      aStack_60 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x2899aa;
      AlignFail(plVar28);
    }
    pTVar19 = *(TcParseTableBase **)
               ((long)&table->has_bits_offset +
               (ulong)pFVar49->aux_idx * 8 + (ulong)table->aux_offset);
    aVar21._0_4_ = uVar47 >> 9 & 3;
    aVar21.data._4_4_ = 0;
    if ((short)aVar21._0_4_ != 2) {
      aStack_50.data._0_4_ = (int)uVar23;
      aStack_48 = aVar30;
      if ((uVar47 >> 9 & 3) == 0) {
        pcVar18 = 
        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc"
        ;
        pcVar13 = "tv == field_layout::kTvDefault || tv == field_layout::kTvWeakPtr";
        iVar10 = 0x9c8;
        goto LAB_00289a0c;
      }
      if (aVar21._0_4_ != 1) {
        pTVar19 = *(TcParseTableBase **)pTVar19;
      }
      aStack_60 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x2899cd;
      pTVar19 = MessageLite::GetTcParseTable((MessageLite *)pTVar19);
      uVar23 = aStack_50.data & 0xffffffff;
      aVar30 = aStack_48;
    }
    if ((byte)((byte)uVar23 | *plVar28 == 0) == 1) {
      pAVar40 = (Arena *)(msg->_internal_metadata_).ptr_;
      if (((ulong)pAVar40 & 1) != 0) {
        pAVar40 = *(Arena **)((ulong)pAVar40 & 0xfffffffffffffffe);
      }
      aStack_60 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x289829;
      pMVar17 = ClassData::New(pTVar19->class_data,pAVar40);
      *plVar28 = (long)pMVar17;
      aVar21 = aVar30;
    }
    uVar52 = (undefined4)aVar21.data;
    if ((uVar47 & 0x1c0) == 0x40) {
      iVar10 = *(int *)(aStack_58.data + 0x58);
      lVar14 = (long)iVar10 + -1;
      iVar48 = (int)lVar14;
      *(int *)(aStack_58.data + 0x58) = iVar48;
      if ((long)iVar10 < 1) {
        return (char *)0x0;
      }
      lVar50 = (long)*(int *)(aStack_58.data + 0x5c) + 1;
      iVar10 = (int)lVar50;
      *(int *)(aStack_58.data + 0x5c) = iVar10;
      aStack_60 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x289877;
      pcVar18 = ParseLoopPreserveNone
                          ((MessageLite *)*plVar28,(char *)aVar30,(ParseContext *)aStack_58,pTVar19)
      ;
      if (pcVar18 == (char *)0x0) {
LAB_002898b6:
        *(int *)(aStack_58.data + 0x5c) = *(int *)(aStack_58.data + 0x5c) + -1;
        *(int *)&((EpsCopyInputStream *)(aStack_58.data + 0x58))->limit_end_ =
             *(int *)&((EpsCopyInputStream *)(aStack_58.data + 0x58))->limit_end_ + 1;
        uVar3 = *(uint32_t *)(aStack_58.data + 0x50);
        *(uint32_t *)(aStack_58.data + 0x50) = 0;
        if (uVar3 == (uint32_t)UNRECOVERED_JUMPTABLE_00) {
          return pcVar18;
        }
        return (char *)0x0;
      }
      iVar4 = *(int *)&((EpsCopyInputStream *)(aStack_58.data + 0x58))->limit_end_;
      if (iVar48 == iVar4) {
        pcVar13 = (Nonnull<const_char_*>)0x0;
      }
      else {
        aStack_60 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x289a28;
        pcVar13 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                            (lVar14,(long)iVar4,"old_depth == depth_");
      }
      if (pcVar13 == (Nonnull<const_char_*>)0x0) {
        if (iVar10 == *(int *)(aStack_58.data + 0x5c)) {
          pcVar13 = (Nonnull<const_char_*>)0x0;
        }
        else {
          aStack_60 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x289a5b;
          pcVar13 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                              (lVar50,(long)*(int *)(aStack_58.data + 0x5c),
                               "old_group_depth == group_depth_");
        }
        if (pcVar13 == (Nonnull<const_char_*>)0x0) goto LAB_002898b6;
        iVar10 = 0x492;
      }
      else {
        iVar10 = 0x491;
      }
    }
    else {
      if ((char)*(byte *)aVar30 < '\0') {
        aStack_60 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x2898e9;
        pVar57 = ReadSizeFallback((char *)aVar30,(uint)*(byte *)aVar30);
        pcVar13 = pVar57.first;
      }
      else {
        pcVar13 = (char *)(aVar30.data + 1);
      }
      if ((pcVar13 == (char *)0x0) || (*(int *)(aStack_58.data + 0x58) < 1)) {
        pcVar13 = (char *)0x0;
      }
      else {
        aStack_60 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x289913;
        EpsCopyInputStream::PushLimit
                  ((EpsCopyInputStream *)&aStack_40,(char *)aStack_58,(int)pcVar13);
        *(int *)(aStack_58.data + 0x58) = *(int *)(aStack_58.data + 0x58) + -1;
        uVar52 = aStack_40.data._0_4_;
      }
      if (pcVar13 == (char *)0x0) {
        return (char *)0x0;
      }
      iVar10 = *(int *)(aStack_58.data + 0x58);
      aStack_60 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x28993d;
      pcVar18 = ParseLoopPreserveNone
                          ((MessageLite *)*plVar28,pcVar13,(ParseContext *)aStack_58,pTVar19);
      if (pcVar18 == (char *)0x0) {
LAB_00289960:
        *(int *)&((EpsCopyInputStream *)(aStack_58.data + 0x58))->limit_end_ =
             *(int *)&((EpsCopyInputStream *)(aStack_58.data + 0x58))->limit_end_ + 1;
        uVar11 = uVar52 + *(int *)(aStack_58.data + 0x1c);
        *(uint *)(aStack_58.data + 0x1c) = uVar11;
        if (*(uint32_t *)(aStack_58.data + 0x50) != 0) {
          return (char *)0x0;
        }
        *(char **)aStack_58 = *(char **)(aStack_58.data + 8) + (int)((int)uVar11 >> 0x1f & uVar11);
        return pcVar18;
      }
      iVar48 = *(int *)&((EpsCopyInputStream *)(aStack_58.data + 0x58))->limit_end_;
      if (iVar10 == iVar48) {
        pcVar13 = (Nonnull<const_char_*>)0x0;
      }
      else {
        aStack_60 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x289a43;
        pcVar13 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                            ((long)iVar10,(long)iVar48,"old_depth == depth_");
      }
      if (pcVar13 == (Nonnull<const_char_*>)0x0) goto LAB_00289960;
      iVar10 = 0x481;
    }
    pcVar18 = 
    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/parse_context.h"
    ;
LAB_00289a0c:
    aStack_60 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x289a11;
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&aStack_40,pcVar18,iVar10,pcVar13);
    aStack_60 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x289a19;
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&aStack_40);
  case 7:
    aVar41.data = (long)&table->has_bits_offset + (ulong)aVar38._0_4_;
    if ((aVar41.data & 3) != 0) {
LAB_00289fe9:
      AlignFail();
    }
    aStack_88.data =
         (long)&table->has_bits_offset +
         (ulong)*(ushort *)(aVar41.data + 8) * 8 + (ulong)table->aux_offset;
    bStack_a9 = *(byte *)(aStack_88.data + 4);
    if (((bStack_a9 & 1) == 0) || ((uVar35 & 7) != 2)) {
      pcVar13 = MpFallback(msg,(char *)aVar30,ctx,(TcFieldData)UNRECOVERED_JUMPTABLE_00,table,
                           hasbits);
      return pcVar13;
    }
    uVar52 = *(undefined4 *)
              ((long)&table->has_bits_offset +
              (ulong)*(ushort *)(aVar41.data + 8) * 8 + (ulong)table->aux_offset);
    aVar51.data = (long)&msg->_vptr_MessageLite + (ulong)*(uint *)aVar41;
    aVar43.data = hasbits;
    aStack_50.data = aVar41.data;
    if ((bStack_a9 & 2) == 0) {
      if ((aVar51.data & 7) != 0) {
LAB_00289fee:
        AlignFail(aVar51.data);
      }
      if ((*(ulong *)aVar51 & 1) != 0) {
        (*MapFieldBaseForParse::sync_map_with_repeated)(aVar51.data,1);
      }
      aVar51.data = aVar51.data + 0x10;
    }
    else if ((aVar51.data & 7) != 0) goto LAB_00289fee;
    aStack_58.data._4_1_ = bStack_a9;
    aStack_58.data._0_4_ = uVar52;
    aStack_58.data._5_3_ = 0;
    aVar41.data = (uint64_t)&aStack_60;
    do {
      pcVar13._2_6_ = 0;
      pcVar13._0_2_ = *(ushort *)(aVar51.data + 0xc);
      aVar21.data = (uint64_t)UntypedMapBase::AllocNode(aVar51.data,(size_t)pcVar13);
      uVar47 = *(ushort *)(aVar51.data + 0xc);
      uVar23 = (ulong)uVar47 - 8;
      if (uVar23 < 8) {
        pcVar13 = (char *)0x8;
        pcVar24 = absl::lts_20250127::log_internal::MakeCheckOpString<long,unsigned_long>
                            (uVar23,8,"node_end - static_cast<char*>(node_key) >= sizeof(uint64_t)")
        ;
      }
      else {
        pcVar24 = (Nonnull<const_char_*>)0x0;
      }
      if (pcVar24 != (Nonnull<const_char_*>)0x0) {
        pcVar13 = 
        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc"
        ;
        iVar10 = 0xb2c;
LAB_0028a039:
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&aStack_80,pcVar13,iVar10,pcVar24);
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&aStack_80);
      }
      *(char **)(aVar21.data + 8) = (char *)0x0;
      *(undefined8 *)((long)(aVar21.data - 8) + (ulong)uVar47) = 0;
      aVar34.data = (uint64_t)&aStack_48;
      f.f = (Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_generated_message_tctable_lite_cc:2866:19),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_generated_message_tctable_lite_cc:2870:19)>
             *)aVar34.data;
      f.this = (UntypedMapBase *)aVar51.data;
      f.node = (NodeBase **)aVar41.data;
      aStack_80 = aVar51;
      aStack_78.data = aVar34.data;
      aStack_70.data = aVar41.data;
      aStack_60 = aVar21;
      aStack_48 = aVar51;
      UntypedMapBase::
      VisitKeyType<google::protobuf::internal::UntypedMapBase::VisitKey<absl::lts_20250127::Overload<google::protobuf::internal::TcParser::MpMap<false>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(std::__cxx11::string*)_1_,google::protobuf::internal::TcParser::MpMap<false>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(void*)_1_>>(google::protobuf::internal::NodeBase*,absl::lts_20250127::Overload<google::protobuf::internal::TcParser::MpMap<false>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(std::__cxx11::string*)_1_,google::protobuf::internal::TcParser::MpMap<false>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(void*)_1_>)const::_lambda(auto:1)_1_>
                ((UntypedMapBase *)aVar51,f);
      aStack_40.data = (uint64_t)&aStack_88;
      f_00.f = (Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_generated_message_tctable_lite_cc:2875:19),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_generated_message_tctable_lite_cc:2878:19),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_generated_message_tctable_lite_cc:2882:19)>
                *)aVar34.data;
      f_00.this = (UntypedMapBase *)aVar51.data;
      f_00.node = (NodeBase **)aVar41.data;
      aVar39 = aVar51;
      wire_bytes._M_len = aVar51;
      aStack_80 = aVar51;
      aStack_78.data = aVar34.data;
      aStack_70.data = aVar41.data;
      aStack_60 = aVar21;
      aStack_48 = aVar51;
      aStack_38 = aVar51;
      UntypedMapBase::
      VisitValueType<google::protobuf::internal::UntypedMapBase::VisitValue<absl::lts_20250127::Overload<google::protobuf::internal::TcParser::MpMap<false>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(std::__cxx11::string*)_2_,google::protobuf::internal::TcParser::MpMap<false>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(google::protobuf::MessageLite*)_1_,google::protobuf::internal::TcParser::MpMap<false>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(void*)_2_>>(google::protobuf::internal::NodeBase*,absl::lts_20250127::Overload<google::protobuf::internal::TcParser::MpMap<false>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(std::__cxx11::string*)_2_,google::protobuf::internal::TcParser::MpMap<false>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(google::protobuf::MessageLite*)_1_,google::protobuf::internal::TcParser::MpMap<false>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(void*)_2_>)const::_lambda(auto:1)_1_>
                ((UntypedMapBase *)aVar51,f_00);
      bVar1 = *(byte *)aVar30;
      aVar27.data._1_7_ = 0;
      aVar27.data._0_1_ = bVar1;
      if ((char)bVar1 < '\0') {
        pcVar13._4_4_ = 0;
        pcVar13._0_4_ = CONCAT31(0,bVar1);
        pVar55 = ReadSizeFallback((char *)aVar30,CONCAT31(0,bVar1));
        aVar27.data = pVar55._8_8_ & 0xffffffff;
      }
      else {
        pVar55._8_8_ = extraout_RDX_02;
        pVar55.first = (char *)(aVar30.data + 1);
        aVar30 = aVar39;
      }
      pPVar29 = pVar55._8_8_;
      aVar39.data = (uint64_t)pVar55.first;
      if (((EpsCopyInputStream *)aVar39.data == (EpsCopyInputStream *)0x0) || (ctx->depth_ < 1)) {
        aVar39.data = 0;
      }
      else {
        aVar30.data = (uint64_t)&aStack_80;
        pcVar13 = (char *)ctx;
        EpsCopyInputStream::PushLimit((EpsCopyInputStream *)aVar30,(char *)ctx,(int)pVar55.first);
        auStack_68._4_4_ = aStack_80.data._0_4_;
        ctx->depth_ = ctx->depth_ + -1;
        pPVar29 = extraout_RDX_03;
      }
      if ((EpsCopyInputStream *)aVar39.data == (EpsCopyInputStream *)0x0) {
LAB_00289cf4:
        ctx_00 = (ParseContext *)0x0;
      }
      else {
        iVar10 = ctx->depth_;
        aVar34 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)(long)iVar10;
        aVar27 = aStack_88;
        aVar30 = aVar21;
        aVar44 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)table;
        aVar43 = aStack_50;
        wire_bytes._M_len = aVar51;
        ctx_00 = (ParseContext *)
                 ParseOneMapEntry((NodeBase *)aVar21,(char *)aVar39,ctx,(FieldAux *)aStack_88,table,
                                  (FieldEntry *)aStack_50,(UntypedMapBase *)aVar51);
        pPVar29 = extraout_RDX_04;
        if (ctx_00 != (ParseContext *)0x0) {
          aVar39 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)(long)ctx->depth_;
          if (iVar10 == ctx->depth_) {
            pcVar24 = (Nonnull<const_char_*>)0x0;
          }
          else {
            aVar30 = aVar34;
            pcVar24 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                                (aVar34.data,aVar39.data,"old_depth == depth_");
            pPVar29 = extraout_RDX_05;
          }
          if (pcVar24 != (Nonnull<const_char_*>)0x0) {
            pcVar13 = 
            "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/parse_context.h"
            ;
            iVar10 = 0x481;
            goto LAB_0028a039;
          }
        }
        ctx->depth_ = ctx->depth_ + 1;
        aVar38._0_4_ = (ctx->super_EpsCopyInputStream).limit_ + auStack_68._4_4_;
        (ctx->super_EpsCopyInputStream).limit_ = aVar38._0_4_;
        pcVar13 = (char *)aVar39;
        if ((ctx->super_EpsCopyInputStream).last_tag_minus_1_ != 0) goto LAB_00289cf4;
        aVar27._0_4_ = (int)aVar38._0_4_ >> 0x1f & aVar38._0_4_;
        aVar27.data._4_4_ = 0;
        (ctx->super_EpsCopyInputStream).limit_end_ =
             (ctx->super_EpsCopyInputStream).buffer_end_ + (int)aVar27._0_4_;
      }
      if (ctx_00 == (ParseContext *)0x0) {
        if (*(long *)(aVar51.data + 0x18) == 0) {
          UntypedMapBase::DeleteNode((UntypedMapBase *)aVar51,(NodeBase *)aVar21);
          pPVar29 = extraout_RDX_06;
          pcVar13 = (char *)aVar21;
        }
        pcVar13 = Error(msg,pcVar13,pPVar29,(TcFieldData)aVar27,table,hasbits);
        return pcVar13;
      }
      if ((bStack_a9 & 0x10) == 0) {
LAB_00289d38:
        if (5 < ((byte)(*(uint *)(aVar51.data + 0xc) >> 0x18) & 0xf)) {
switchD_00289d5e_caseD_3:
          Unreachable("/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc"
                      ,0xb68);
        }
        aVar38._0_4_ = *(uint *)(aVar51.data + 0xc) >> 0x18 & 0xf;
        puVar22 = &switchD_00289d5e::switchdataD_0045a8f4;
        pcVar24 = (Nonnull<const_char_*>)
                  ((long)&switchD_00289d5e::switchdataD_0045a8f4 +
                  (long)(int)(&switchD_00289d5e::switchdataD_0045a8f4)[aVar38._0_4_]);
        switch(aVar38._0_4_) {
        case 0:
          KeyMapBase<bool>::InsertOrReplaceNode((KeyMapBase<bool> *)aVar51,(KeyNode *)aVar21);
          break;
        case 1:
          KeyMapBase<unsigned_int>::InsertOrReplaceNode
                    ((KeyMapBase<unsigned_int> *)aVar51,(KeyNode *)aVar21);
          break;
        case 2:
          KeyMapBase<unsigned_long>::InsertOrReplaceNode
                    ((KeyMapBase<unsigned_long> *)aVar51,(KeyNode *)aVar21);
          break;
        default:
          goto switchD_00289d5e_caseD_3;
        case 5:
          KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::InsertOrReplaceNode
                    ((KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)aVar51,(KeyNode *)aVar21);
          break;
        case 6:
          LOCK();
          uVar52 = *(undefined4 *)(pcVar24 + aVar34.data);
          *(int *)(pcVar24 + aVar34.data) = (int)pcVar24;
          pcVar18 = (char *)CONCAT44((int)((ulong)pcVar24 >> 0x20),uVar52);
          UNLOCK();
          *pcVar18 = *pcVar18 + (char)uVar52;
          goto code_r0x0028b750;
        case 7:
          cRam00000000015c4cbb = (cRam00000000015c4cbb + '\f') - (0x57 < (byte)aVar34.data);
          goto code_r0x0028b780;
        case 8:
          pcVar18 = (char *)(ulong)(byte)((char)pcVar24 -
                                         (0xffffffffffba570bU <
                                         (ulong)(long)(int)(&switchD_00289d5e::switchdataD_0045a8f4)
                                                           [aVar38._0_4_]));
          goto code_r0x0028b750;
        case 9:
        case 10:
          goto switchD_00289d5e_caseD_9;
        case 0xb:
          goto switchD_0028b761_caseD_2;
        case 0xc:
          pcVar13 = MpRepeatedVarintT<false,unsigned_int,(unsigned_short)0>
                              ((MessageLite *)wire_bytes._M_len,pcVar13,pPVar29,
                               (TcFieldData)0x45a8f3,(TcParseTableBase *)aVar44,aVar43.data);
          return pcVar13;
        case 0xd:
          goto switchD_0028b761_caseD_9;
        case 0xe:
          goto code_r0x0028bbe6;
        case 0xf:
          aVar21 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)puVar22;
          ctx_00 = pPVar29;
          ctx = (ParseContext *)pcVar13;
          aVar41 = aVar30;
          aVar51 = aVar44;
          goto code_r0x0028bbe6;
        }
      }
      else {
        puVar22 = (uint *)UntypedMapBase::GetValue<int>((UntypedMapBase *)aVar51,(NodeBase *)aVar21)
        ;
        aVar38._0_4_ = *puVar22;
        puVar22 = *(uint **)(aStack_88.data + 8);
        pcVar13 = (char *)(long)(short)*puVar22;
        aVar30.data._0_4_ = *puVar22 >> 0x10;
        aVar30.data._4_4_ = 0;
        pPVar29 = (ParseContext *)(((long)(int)aVar38._0_4_ - (long)pcVar13) - (long)aVar30);
        if ((EpsCopyInputStream *)((long)(int)aVar38._0_4_ - (long)pcVar13) < aVar30.data)
        goto LAB_00289d38;
        uVar25 = puVar22[1];
        pcVar13._4_4_ = 0;
        pcVar13._0_4_ = uVar25;
        aVar30.data._2_6_ = 0;
        aVar30.data._0_2_ = (ushort)uVar25;
        if (aVar30.data <= pPVar29) {
          pPVar29 = (ParseContext *)(ulong)(uVar25 >> 0x10);
          aVar27.data = 0;
          do {
            pcVar13 = (char *)aVar27;
            aVar30._1_7_ = (undefined7)((ulong)aVar30 >> 8);
            aVar30.data._0_1_ = pcVar13 < pPVar29;
            if (pcVar13 >= pPVar29) goto LAB_00289e08;
            uVar46 = *(uint *)((long)puVar22 + (long)pcVar13 * 4 + (ulong)(uVar25 >> 3 & 0x1ffc) + 8
                              );
            aVar30.data._4_4_ = 0;
            aVar30.data._0_4_ = uVar46;
            aVar43.data._1_7_ = 0;
            aVar43.data._0_1_ = (int)aVar38._0_4_ < (int)uVar46;
            aVar44.data = ((long)pcVar13 * 2 - (long)aVar43) + 2;
            aVar27.data = aVar44.data;
          } while (uVar46 != aVar38._0_4_);
          goto LAB_00289d38;
        }
        aVar30.data._1_1_ = (char)(uVar25 >> 8);
        aVar30.data._0_1_ = (puVar22[((ulong)pPVar29 >> 5) + 2] >> ((uint)pPVar29 & 0x1f) & 1) != 0;
        aVar30.data._2_6_ = 0;
LAB_00289e08:
        if ((char)aVar30.data != '\0') goto LAB_00289d38;
        aVar43 = aStack_58;
        WriteMapEntryAsUnknown
                  (msg,table,(UntypedMapBase *)aVar51,uVar35,(NodeBase *)aVar21,
                   SUB85(aStack_58.data,0));
        aVar44 = aVar21;
      }
      pPVar29 = (ParseContext *)(ctx->super_EpsCopyInputStream).limit_end_;
      if (pPVar29 <= ctx_00) {
        uVar23 = (ulong)table->has_bits_offset;
        if (uVar23 == 0) {
          return (char *)ctx_00;
        }
        goto LAB_00289f49;
      }
      bVar1 = *(byte *)&(ctx_00->super_EpsCopyInputStream).limit_end_;
      aVar38._0_4_ = (uint)bVar1;
      aVar30.data = (long)&(ctx_00->super_EpsCopyInputStream).limit_end_ + 1;
      if ((char)bVar1 < '\0') {
        uVar37 = (uint7)(((ulong)bVar1 << 0x39) >> 8);
        lVar14 = CONCAT71(uVar37,*(char *)aVar30);
        if (*(char *)aVar30 < '\0') {
          uVar37 = uVar37 >> 7 | (uint7)((ulong)(lVar14 << 0x39) >> 8);
          cVar2 = *(char *)((long)&(ctx_00->super_EpsCopyInputStream).limit_end_ + 2);
          lVar14 = CONCAT71(uVar37,cVar2);
          if (cVar2 < '\0') {
            uVar37 = uVar37 >> 7 | (uint7)((ulong)(lVar14 << 0x39) >> 8);
            cVar2 = *(char *)((long)&(ctx_00->super_EpsCopyInputStream).limit_end_ + 3);
            lVar14 = CONCAT71(uVar37,cVar2);
            if (cVar2 < '\0') {
              uVar37 = uVar37 >> 7 | (uint7)((ulong)(lVar14 << 0x39) >> 8);
              cVar2 = *(char *)((long)&(ctx_00->super_EpsCopyInputStream).limit_end_ + 4);
              if (cVar2 < '\0') {
                aVar38._0_4_ = 0;
                aVar30.data = 0;
              }
              else {
                aVar38._0_4_ = (int)CONCAT71(uVar37,cVar2) << 0x1c | (uint)(uVar37 >> 0x1c);
                aVar30.data = (long)&(ctx_00->super_EpsCopyInputStream).limit_end_ + 5;
              }
            }
            else {
              aVar38._0_4_ = (int)lVar14 << 0x15 | (uint)(uVar37 >> 0x23);
              aVar30.data = (long)&(ctx_00->super_EpsCopyInputStream).limit_end_ + 4;
            }
          }
          else {
            aVar38._0_4_ = (int)lVar14 << 0xe | (uint)(uVar37 >> 0x2a);
            aVar30.data = (long)&(ctx_00->super_EpsCopyInputStream).limit_end_ + 3;
          }
        }
        else {
          aVar38._0_4_ = (int)lVar14 << 7 | (uint)(((ulong)bVar1 << 0x39) >> 0x39);
          aVar30.data = (long)&(ctx_00->super_EpsCopyInputStream).limit_end_ + 2;
        }
      }
    } while (aVar38._0_4_ == uVar35);
    if (ctx_00 < pPVar29) {
      uVar47 = *(ushort *)&(ctx_00->super_EpsCopyInputStream).limit_end_;
      uVar11 = (uint)table->fast_idx_mask & (uint)uVar47;
      if ((uVar11 & 7) != 0) {
        protobuf_assumption_failed
                  ("(idx & 7) == 0",
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_impl.h"
                   ,0x452);
      }
      uVar23 = (ulong)(uVar11 & 0xfffffff8);
      pcVar13 = (char *)(**(code **)(&table[1].has_bits_offset + uVar23))
                                  (msg,ctx_00,ctx,
                                   (ulong)uVar47 ^ *(ulong *)(&table[1].fast_idx_mask + uVar23 * 2),
                                   table,hasbits);
      return pcVar13;
    }
    uVar23 = (ulong)table->has_bits_offset;
    if (uVar23 != 0) {
LAB_00289f49:
      puVar22 = (uint *)((long)&msg->_vptr_MessageLite + uVar23);
      if (((ulong)puVar22 & 3) != 0) goto LAB_00289fe9;
      *puVar22 = *puVar22 | uVar11;
    }
    return (char *)ctx_00;
  case 8:
    if ((ulong)table->has_bits_offset != 0) {
      puVar22 = (uint *)((long)&msg->_vptr_MessageLite + (ulong)table->has_bits_offset);
      if (((ulong)puVar22 & 3) != 0) {
        AlignFail();
      }
      *puVar22 = *puVar22 | uVar11;
    }
    return (char *)0x0;
  case 9:
    pFVar12 = (FieldEntry *)((long)&table->has_bits_offset + (ulong)aVar38._0_4_);
    if (((ulong)pFVar12 & 3) != 0) {
      aStack_80.data = 0x28a35b;
      AlignFail(pFVar12);
    }
    uVar47 = pFVar12->type_card;
    uVar11 = uVar47 & 0x30;
    if (uVar11 == 0x20) {
      pcVar13 = MpRepeatedVarint<true>
                          (msg,(char *)aVar30,ctx,(TcFieldData)UNRECOVERED_JUMPTABLE_00,table,
                           hasbits);
      return pcVar13;
    }
    if ((uVar35 & 7) != 0) {
      UNRECOVERED_JUMPTABLE_01 = table->fallback;
      goto LAB_0028a0e4;
    }
    aVar44 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)(long)*(char *)aVar30;
    if ((long)aVar44.data < 0) {
      aVar51.data = 0xffffffffffffff80;
      aVar41.data = (long)*(char *)(aVar30.data + 1) << 7 | 0x7f;
      if ((long)aVar41 < 0) {
        uVar23 = (long)*(char *)(aVar30.data + 2) << 0xe | 0x3fff;
        if ((long)uVar23 < 0) {
          aVar41.data = aVar41.data & ((long)*(char *)(aVar30.data + 3) << 0x15 | 0x1fffffU);
          if ((long)aVar41 < 0) {
            uVar23 = uVar23 & ((long)*(char *)(aVar30.data + 4) << 0x1c | 0xfffffffU);
            if ((long)uVar23 < 0) {
              aVar41.data = aVar41.data & ((long)*(char *)(aVar30.data + 5) << 0x23 | 0x7ffffffffU);
              if ((long)aVar41 < 0) {
                uVar23 = uVar23 & ((long)*(char *)(aVar30.data + 6) << 0x2a | 0x3ffffffffffU);
                if ((long)uVar23 < 0) {
                  aVar41.data = aVar41.data &
                                ((long)*(char *)(aVar30.data + 7) << 0x31 | 0x1ffffffffffffU);
                  if ((long)aVar41 < 0) {
                    uVar23 = uVar23 & ((ulong)*(byte *)(aVar30.data + 8) << 0x38 | 0xffffffffffffff)
                    ;
                    if ((long)uVar23 < 0) {
                      aStack_60.data = aVar30.data + 10;
                      if (*(char *)(aVar30.data + 9) != '\x01') {
                        bVar1 = *(byte *)(aVar30.data + 9);
                        aVar51.data._1_7_ = 0xffffffffffffff;
                        aVar51.data._0_1_ = bVar1;
                        if ((char)bVar1 < '\0') {
                          aStack_60.data = 0;
                          goto LAB_0028a108;
                        }
                        if ((bVar1 & 1) == 0) {
                          uVar23 = uVar23 ^ 0x8000000000000000;
                        }
                      }
                    }
                    else {
                      aStack_60.data = aVar30.data + 9;
                    }
                  }
                  else {
                    aStack_60.data = aVar30.data + 8;
                  }
                }
                else {
                  aStack_60.data = aVar30.data + 7;
                }
              }
              else {
                aStack_60.data = aVar30.data + 6;
              }
            }
            else {
              aStack_60.data = aVar30.data + 5;
            }
          }
          else {
            aStack_60.data = aVar30.data + 4;
          }
        }
        else {
          aStack_60.data = aVar30.data + 3;
        }
        aVar41.data = aVar41.data & uVar23;
      }
      else {
        aStack_60.data = aVar30.data + 2;
      }
      aVar44.data = aVar44.data & aVar41.data;
    }
    else {
      aStack_60.data = aVar30.data + 1;
      aVar41 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)UNRECOVERED_JUMPTABLE_00;
      aVar51 = aVar30;
    }
LAB_0028a108:
    if ((EpsCopyInputStream *)aStack_60.data == (EpsCopyInputStream *)0x0) {
      pcVar13 = Error(msg,(char *)aVar51,ctx,(TcFieldData)aVar41,table,hasbits);
      return pcVar13;
    }
    aVar38._0_4_ = uVar47 & 0x600;
    pPVar29 = (ParseContext *)(ulong)aVar38._0_4_;
    aStack_48.data._0_4_ = uVar47 & 0x1c0;
    aStack_48.data._4_4_ = 0;
    aStack_50.data = (ulong)CONCAT24(uVar47,aStack_50._0_4_) & 0x1c0ffffffff;
    uVar25 = (uint)aVar44.data;
    if ((EpsCopyInputStream *)aStack_48.data == (EpsCopyInputStream *)0xc0) {
      auStack_68 = (undefined1  [8])hasbits;
      aStack_58 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)ctx;
      if (aVar38._0_4_ == 0x200) {
        aVar44.data = -(ulong)(uVar25 & 1) ^ aVar44.data >> 1;
      }
    }
    else {
      auStack_68 = (undefined1  [8])hasbits;
      aStack_58 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)ctx;
      if (aStack_48.data._0_4_ == 0x80) {
        if ((uVar47 >> 10 & 1) == 0) {
          if (aVar38._0_4_ == 0x200) {
            aVar44 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
                     (long)(int)(-(uVar25 & 1) ^ (uint)(aVar44.data >> 1) & 0x7fffffff);
          }
        }
        else {
          puVar6 = *(uint32_t **)
                    ((long)&table->has_bits_offset +
                    (ulong)pFVar12->aux_idx * 8 + (ulong)table->aux_offset);
          if (aVar38._0_4_ == 0x600) {
            bVar8 = (int)puVar6 <= (int)uVar25;
            pPVar29 = (ParseContext *)(ulong)CONCAT31(6,bVar8);
            bVar8 = (int)uVar25 <= (int)((ulong)puVar6 >> 0x20) && bVar8;
          }
          else {
            aStack_80.data = 0x28a1e9;
            aStack_70 = aVar44;
            bVar8 = ValidateEnum(uVar25,puVar6);
            aVar44 = aStack_70;
          }
          if (bVar8 == false) {
            pcVar13 = MpUnknownEnumFallback
                                (msg,(char *)aVar30,(ParseContext *)aStack_58,
                                 (TcFieldData)UNRECOVERED_JUMPTABLE_00,table,(uint64_t)auStack_68);
            return pcVar13;
          }
        }
      }
    }
    aStack_70 = aVar44;
    if (uVar11 == 0x30) {
      aStack_80.data = 0x28a246;
      ChangeOneof(table,pFVar12,uVar35 >> 3,pPVar29,msg);
    }
    else if (uVar11 == 0x10) {
      puVar22 = (uint *)((long)&msg->_vptr_MessageLite + (ulong)((uint)pFVar12->has_idx >> 5) * 4);
      if (((ulong)puVar22 & 3) != 0) {
        aStack_80.data = 0x28a3ca;
        AlignFail();
      }
      *puVar22 = *puVar22 | 1 << ((byte)pFVar12->has_idx & 0x1f);
    }
    aStack_80.data = 0x28a256;
    pvVar20 = MaybeGetSplitBase(msg,true,table);
    ctx = (ParseContext *)aStack_58;
    if (aStack_50._4_4_ == 0xc0) {
      paVar32 = (anon_union_8_1_898a9ca8_for_TcFieldData_0 *)
                ((long)pvVar20 + (ulong)pFVar12->offset);
      if (((ulong)paVar32 & 7) != 0) {
        aStack_80.data = 0x28a3c5;
        AlignFail(paVar32);
      }
      paVar32->data = (uint64_t)aStack_70;
    }
    else if (aStack_50._4_4_ == 0x80) {
      puVar33 = (undefined4 *)((long)pvVar20 + (ulong)pFVar12->offset);
      if (((ulong)puVar33 & 3) != 0) {
        aStack_80.data = 0x28a402;
        AlignFail(puVar33);
      }
      *puVar33 = (int)aStack_70.data;
    }
    else {
      if (aStack_50._4_4_ == 0) {
        pcVar24 = (Nonnull<const_char_*>)0x0;
      }
      else {
        aStack_80.data = 0x28a3e8;
        pcVar24 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                            (aStack_48.data,0,
                             "rep == static_cast<uint16_t>(field_layout::kRep8Bits)");
      }
      if (pcVar24 != (Nonnull<const_char_*>)0x0) {
        aStack_80.data = 0x28a4ae;
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&aStack_40,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc"
                   ,0x829,pcVar24);
        aStack_80.data = 0x28a4b6;
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&aStack_40);
      }
      *(bool *)((long)pvVar20 + (ulong)pFVar12->offset) =
           (EpsCopyInputStream *)aStack_70.data != (EpsCopyInputStream *)0x0;
    }
    if (*(EpsCopyInputStream **)ctx <= aStack_60.data) {
      if ((ulong)table->has_bits_offset != 0) {
        puVar22 = (uint *)((long)&msg->_vptr_MessageLite + (ulong)table->has_bits_offset);
        if (((ulong)puVar22 & 3) != 0) {
          aStack_80.data = 0x28a3d2;
          AlignFail(puVar22);
        }
        *puVar22 = *puVar22 | auStack_68._0_4_;
      }
      return (char *)aStack_60.data;
    }
    uVar11 = (uint)table->fast_idx_mask & (uint)*(ushort *)aStack_60;
    if ((uVar11 & 7) != 0) {
      aStack_80.data = 0x28a41a;
      protobuf_assumption_failed
                ("(idx & 7) == 0",
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_impl.h"
                 ,0x452);
    }
    uVar23 = (ulong)(uVar11 & 0xfffffff8);
    UNRECOVERED_JUMPTABLE_00 =
         (code *)((ulong)*(ushort *)aStack_60 ^ *(ulong *)(&table[1].fast_idx_mask + uVar23 * 2));
    UNRECOVERED_JUMPTABLE_01 = *(TailCallParseFunc *)(&table[1].has_bits_offset + uVar23);
    aVar30 = aStack_60;
    hasbits = (uint64_t)auStack_68;
LAB_0028a0e4:
    pcVar13 = (*UNRECOVERED_JUMPTABLE_01)
                        (msg,(char *)aVar30,ctx,(TcFieldData)UNRECOVERED_JUMPTABLE_00,table,hasbits)
    ;
    return pcVar13;
  case 10:
    uVar23 = (long)&table->has_bits_offset + (ulong)aVar38._0_4_;
    if ((uVar23 & 3) != 0) {
      aStack_50 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x28a614;
      AlignFail();
    }
    if ((uVar35 & 7) != 2) {
      pcVar13 = MpRepeatedVarint<true>
                          (msg,(char *)aVar30,ctx,(TcFieldData)UNRECOVERED_JUMPTABLE_00,table,
                           hasbits);
      return pcVar13;
    }
    uVar47 = *(ushort *)(uVar23 + 10);
    if ((ulong)table->has_bits_offset != 0) {
      puVar22 = (uint *)((long)&msg->_vptr_MessageLite + (ulong)table->has_bits_offset);
      if (((ulong)puVar22 & 3) != 0) {
        aStack_50 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x28a61c;
        AlignFail(puVar22);
      }
      *puVar22 = *puVar22 | uVar11;
    }
    uVar31 = uVar47 >> 6;
    uVar9 = uVar31 & 7;
    if ((uVar31 & 7) == 0) {
      pcVar13 = MpPackedVarintT<true,bool,(unsigned_short)0>
                          (msg,(char *)aVar30,ctx,(TcFieldData)UNRECOVERED_JUMPTABLE_00,table,
                           hasbits);
      return pcVar13;
    }
    if (uVar9 == 2) {
      pcVar13 = MpPackedVarintT<true,unsigned_int,(unsigned_short)0>
                          (msg,(char *)aVar30,ctx,(TcFieldData)UNRECOVERED_JUMPTABLE_00,table,
                           hasbits);
      return pcVar13;
    }
    if (uVar9 != 3) {
      aStack_50 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x28a643;
      Unreachable("/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc"
                  ,0x8f9);
    }
    uVar11 = uVar47 & 0x600;
    if ((short)uVar11 != 0) {
      if (uVar11 == 0x200) {
        pcVar24 = (Nonnull<const_char_*>)0x0;
      }
      else {
        aStack_50.data = 0x28a62d;
        pcVar24 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                            ((ulong)uVar11,0x200,"xform_val == +field_layout::kTvZigZag");
      }
      if (pcVar24 != (Nonnull<const_char_*>)0x0) {
        aStack_50 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x28a65f;
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&aStack_40,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc"
                   ,0x8db,pcVar24);
        aStack_50 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)&UNK_0028a667;
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&aStack_40);
      }
    }
    pcVar13 = MpPackedVarintT<true,unsigned_long,(unsigned_short)0>
                        (msg,(char *)aVar30,ctx,(TcFieldData)UNRECOVERED_JUMPTABLE_00,table,hasbits)
    ;
    return pcVar13;
  case 0xb:
    pFVar49 = (FieldEntry *)((long)&table->has_bits_offset + (ulong)aVar38._0_4_);
    pFVar12 = pFVar49;
    if (((ulong)pFVar49 & 3) != 0) goto LAB_0028a823;
    uVar47 = pFVar49->type_card & 0x30;
    if (uVar47 == 0x20) {
      pcVar13 = MpRepeatedFixed<true>
                          (msg,(char *)aVar30,ctx,(TcFieldData)UNRECOVERED_JUMPTABLE_00,table,
                           hasbits);
      return pcVar13;
    }
    uVar11 = pFVar49->type_card & 0x1c0;
    aVar44 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)UNRECOVERED_JUMPTABLE_00;
    if ((ulong)uVar11 == 0xc0) {
      if ((uVar35 & 7) != 1) {
LAB_0028a738:
        UNRECOVERED_JUMPTABLE_01 = table->fallback;
        goto LAB_0028a7e6;
      }
    }
    else {
      if (uVar11 == 0x80) {
        pcVar24 = (Nonnull<const_char_*>)0x0;
      }
      else {
        aStack_70.data = 0x28a850;
        aStack_60.data = hasbits;
        aStack_58 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)ctx;
        aStack_50 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)msg;
        aStack_48 = aVar30;
        pcVar24 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                            ((ulong)uVar11,0x80,
                             "rep == static_cast<uint16_t>(field_layout::kRep32Bits)");
        ctx = (ParseContext *)aStack_58;
        aVar30 = aStack_48;
        msg = (MessageLite *)aStack_50;
        hasbits = aStack_60.data;
      }
      if (pcVar24 != (Nonnull<const_char_*>)0x0) {
        aStack_70 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x28a88a;
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&aStack_40,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc"
                   ,0x77f,pcVar24);
        aStack_70 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x28a892;
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&aStack_40);
      }
      if ((uVar35 & 7) != 5) goto LAB_0028a738;
    }
    aStack_60.data = hasbits;
    aStack_58 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)ctx;
    if (uVar47 == 0x30) {
      aStack_70 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x28a75a;
      ChangeOneof(table,pFVar49,uVar35 >> 3,(ParseContext *)aVar44,msg);
    }
    else if (uVar47 == 0x10) {
      pFVar12 = (FieldEntry *)((long)msg + (ulong)((uint)pFVar49->has_idx >> 5) * 4);
      if (((ulong)pFVar12 & 3) != 0) goto LAB_0028a823;
      pFVar12->offset = pFVar12->offset | 1 << ((byte)pFVar49->has_idx & 0x1f);
    }
    aStack_70.data = 0x28a774;
    pvVar20 = MaybeGetSplitBase(msg,true,table);
    pFVar12 = (FieldEntry *)((ulong)pFVar49->offset + (long)pvVar20);
    if (uVar11 == 0xc0) {
      if (((ulong)pFVar12 & 7) != 0) {
        aStack_70 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x28a86e;
        AlignFail();
      }
      uVar7 = *(undefined8 *)aVar30;
      pFVar12->offset = (int)uVar7;
      pFVar12->has_idx = (int)((ulong)uVar7 >> 0x20);
      lVar14 = 8;
    }
    else {
      if (((ulong)pFVar12 & 3) != 0) goto LAB_0028a823;
      pFVar12->offset = *(uint32_t *)aVar30;
      lVar14 = 4;
    }
    aVar30.data = aVar30.data + lVar14;
    if (aVar30.data < *(EpsCopyInputStream **)aStack_58) {
      uVar11 = (uint)table->fast_idx_mask & (uint)*(ushort *)aVar30;
      if ((uVar11 & 7) != 0) {
        aStack_70.data = (uint64_t)MpPackedFixed<true>;
        protobuf_assumption_failed
                  ("(idx & 7) == 0",
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_impl.h"
                   ,0x452);
      }
      uVar23 = (ulong)(uVar11 & 0xfffffff8);
      UNRECOVERED_JUMPTABLE_00 =
           (code *)((ulong)*(ushort *)aVar30 ^ *(ulong *)(&table[1].fast_idx_mask + uVar23 * 2));
      UNRECOVERED_JUMPTABLE_01 = *(TailCallParseFunc *)(&table[1].has_bits_offset + uVar23);
      ctx = (ParseContext *)aStack_58;
      hasbits = aStack_60.data;
LAB_0028a7e6:
      pcVar13 = (*UNRECOVERED_JUMPTABLE_01)
                          (msg,(char *)aVar30,ctx,(TcFieldData)UNRECOVERED_JUMPTABLE_00,table,
                           hasbits);
      return pcVar13;
    }
    if ((ulong)table->has_bits_offset != 0) {
      pFVar12 = (FieldEntry *)((long)msg + (ulong)table->has_bits_offset);
      if (((ulong)pFVar12 & 3) != 0) {
LAB_0028a823:
        aStack_70 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x28a828;
        AlignFail(pFVar12);
      }
      pFVar12->offset = pFVar12->offset | (uint)aStack_60.data;
    }
    return (char *)aVar30.data;
  case 0xc:
    puVar22 = (uint *)((long)&table->has_bits_offset + (ulong)aVar38._0_4_);
    if (((ulong)puVar22 & 3) != 0) {
      aStack_60 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x28aabc;
      AlignFail(puVar22);
    }
    if ((uVar35 & 7) != 2) {
      pcVar13 = MpRepeatedFixed<true>
                          (msg,(char *)aVar30,ctx,(TcFieldData)UNRECOVERED_JUMPTABLE_00,table,
                           hasbits);
      return pcVar13;
    }
    uVar47 = *(ushort *)((long)puVar22 + 10);
    aStack_60 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x28a8fd;
    aStack_50 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)ctx;
    aStack_48.data = hasbits;
    pvVar20 = MaybeGetSplitBase(msg,true,table);
    bVar1 = *(byte *)aVar30;
    uVar11 = (uint)bVar1;
    if ((char)bVar1 < '\0') {
      aStack_60 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x28a934;
      pVar57 = ReadSizeFallback((char *)aVar30,(uint)bVar1);
      uVar11 = pVar57.second;
      pcVar13 = pVar57.first;
    }
    else {
      pcVar13 = (char *)(aVar30.data + 1);
    }
    uVar35 = uVar47 & 0x1c0;
    if ((ulong)uVar35 == 0xc0) {
      puVar36 = (uint64_t *)((long)pvVar20 + (ulong)*puVar22);
      if (((ulong)puVar36 & 7) != 0) {
LAB_0028aabc:
        aStack_60 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x28aac4;
        AlignFail(puVar36);
      }
      if ((undefined1 *)*puVar36 == kZeroBuffer) {
        aVar30 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)(msg->_internal_metadata_).ptr_;
        if ((aVar30.data & 1) != 0) {
          aVar30 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
                   ((anon_union_8_1_898a9ca8_for_TcFieldData_0 *)(aVar30.data & 0xfffffffffffffffe))
                   ->data;
        }
        if ((anon_union_8_1_898a9ca8_for_TcFieldData_0 *)aVar30.data ==
            (anon_union_8_1_898a9ca8_for_TcFieldData_0 *)0x0) {
          aStack_60 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x28ab1c;
          this = (RepeatedField<unsigned_long> *)operator_new(0x10);
          aStack_60 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x28ab29;
          RepeatedField<unsigned_long>::RepeatedField(this,(Arena *)0x0);
        }
        else {
          aStack_60 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x28a989;
          pvVar20 = Arena::Allocate((Arena *)aVar30,0x10);
          aStack_60 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x28a999;
          aStack_40 = aVar30;
          this = Arena::InternalHelper<google::protobuf::RepeatedField<unsigned_long>>::
                 Construct<google::protobuf::Arena*>(pvVar20,(Arena **)&aStack_40);
        }
        *puVar36 = (uint64_t)this;
      }
      aVar44 = aStack_50;
      aVar30.data = *puVar36;
      aStack_60 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x28a9b7;
      puVar15 = (ushort *)
                EpsCopyInputStream::ReadPackedFixed<unsigned_long>
                          ((EpsCopyInputStream *)aStack_50,pcVar13,uVar11,
                           (RepeatedField<unsigned_long> *)aVar30);
      pPVar29 = extraout_RDX_07;
    }
    else {
      if (uVar35 == 0x80) {
        pcVar24 = (Nonnull<const_char_*>)0x0;
      }
      else {
        aStack_58.data._4_4_ = uVar11;
        aStack_60 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x28aaf5;
        pcVar24 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                            ((ulong)uVar35,0x80,
                             "rep == static_cast<uint16_t>(field_layout::kRep32Bits)");
        uVar11 = (uint)((ulong)aStack_58 >> 0x20);
      }
      if (pcVar24 != (Nonnull<const_char_*>)0x0) {
        aStack_60 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x28ab72;
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&aStack_40,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc"
                   ,0x7e4,pcVar24);
        aStack_60 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x28ab7a;
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&aStack_40);
      }
      puVar36 = (uint64_t *)((long)pvVar20 + (ulong)*puVar22);
      if (((ulong)puVar36 & 7) != 0) goto LAB_0028aabc;
      if ((undefined1 *)*puVar36 == kZeroBuffer) {
        aVar30 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)(msg->_internal_metadata_).ptr_;
        if ((aVar30.data & 1) != 0) {
          aVar30 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
                   ((anon_union_8_1_898a9ca8_for_TcFieldData_0 *)(aVar30.data & 0xfffffffffffffffe))
                   ->data;
        }
        if ((anon_union_8_1_898a9ca8_for_TcFieldData_0 *)aVar30.data ==
            (anon_union_8_1_898a9ca8_for_TcFieldData_0 *)0x0) {
          aStack_60 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x28ab44;
          this_00 = (RepeatedField<unsigned_int> *)operator_new(0x10);
          aStack_60 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x28ab51;
          RepeatedField<unsigned_int>::RepeatedField(this_00,(Arena *)0x0);
        }
        else {
          aStack_60 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x28aa16;
          pvVar20 = Arena::Allocate((Arena *)aVar30,0x10);
          aStack_60 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x28aa26;
          aStack_40 = aVar30;
          this_00 = Arena::InternalHelper<google::protobuf::RepeatedField<unsigned_int>>::
                    Construct<google::protobuf::Arena*>(pvVar20,(Arena **)&aStack_40);
        }
        *puVar36 = (uint64_t)this_00;
      }
      aVar44 = aStack_50;
      aVar30.data = *puVar36;
      aStack_60 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x28aa44;
      puVar15 = (ushort *)
                EpsCopyInputStream::ReadPackedFixed<unsigned_int>
                          ((EpsCopyInputStream *)aStack_50,pcVar13,uVar11,
                           (RepeatedField<unsigned_int> *)aVar30);
      pPVar29 = extraout_RDX_08;
    }
    if (puVar15 == (ushort *)0x0) {
      pcVar13 = Error(msg,pcVar13,pPVar29,(TcFieldData)aVar30,table,aStack_48.data);
      return pcVar13;
    }
    if ((((ParseContext *)aVar44.data)->super_EpsCopyInputStream).limit_end_ <= puVar15) {
      if ((ulong)table->has_bits_offset != 0) {
        puVar22 = (uint *)((long)&msg->_vptr_MessageLite + (ulong)table->has_bits_offset);
        if (((ulong)puVar22 & 3) != 0) {
          aStack_60 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x28ab06;
          AlignFail(puVar22);
        }
        *puVar22 = *puVar22 | (uint)aStack_48.data;
      }
      return (char *)puVar15;
    }
    uVar11 = (uint)table->fast_idx_mask & (uint)*puVar15;
    if ((uVar11 & 7) != 0) {
      aStack_60 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)&LAB_0028ab92;
      protobuf_assumption_failed
                ("(idx & 7) == 0",
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_impl.h"
                 ,0x452);
    }
    uVar23 = (ulong)(uVar11 & 0xfffffff8);
    pcVar13 = (char *)(**(code **)(&table[1].has_bits_offset + uVar23))
                                (msg,puVar15,aVar44.data,
                                 (ulong)*puVar15 ^ *(ulong *)(&table[1].fast_idx_mask + uVar23 * 2),
                                 table);
    return pcVar13;
  case 0xd:
    aVar44.data = (long)&table->has_bits_offset + (ulong)aVar38._0_4_;
    if ((aVar44.data & 3) != 0) {
      aStack_60 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x28afb1;
      AlignFail(aVar44.data);
    }
    if ((uVar35 & 7) != 2) {
      UNRECOVERED_JUMPTABLE_01 = table->fallback;
      goto LAB_0028ac18;
    }
    uVar47 = *(ushort *)(aVar44.data + 10);
    uVar31 = uVar47 & 0x30;
    if (uVar31 == 0x20) {
      pcVar13 = MpRepeatedString<true>
                          (msg,(char *)aVar30,ctx,(TcFieldData)UNRECOVERED_JUMPTABLE_00,table,
                           hasbits);
      return pcVar13;
    }
    if (uVar31 == 0x10) {
      uVar11 = *(uint *)(aVar44.data + 4);
      UNRECOVERED_JUMPTABLE_00._4_4_ = 0;
      UNRECOVERED_JUMPTABLE_00._0_4_ = uVar11;
      puVar22 = (uint *)((long)&msg->_vptr_MessageLite + (ulong)(uVar11 >> 5) * 4);
      if (((ulong)puVar22 & 3) != 0) {
        aStack_60 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x28afd7;
        aStack_50 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)ctx;
        aStack_38.data = hasbits;
        AlignFail();
      }
      *puVar22 = *puVar22 | 1 << ((byte)uVar11 & 0x1f);
LAB_0028ac80:
      aStack_58.data = aStack_58.data & 0xffffffff00000000;
      aStack_50 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)ctx;
      aStack_38.data = hasbits;
    }
    else {
      if (uVar31 != 0x30) goto LAB_0028ac80;
      UNRECOVERED_JUMPTABLE_00._0_4_ = uVar35 >> 3;
      UNRECOVERED_JUMPTABLE_00._4_4_ = 0;
      aStack_60 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x28ac78;
      aStack_50 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)ctx;
      aStack_38.data = hasbits;
      bVar8 = ChangeOneof(table,(FieldEntry *)aVar44,UNRECOVERED_JUMPTABLE_00._0_4_,
                          (ParseContext *)UNRECOVERED_JUMPTABLE_00,msg);
      aStack_58.data._0_4_ = (int)CONCAT71(extraout_var_00,bVar8);
    }
    uVar45 = (uint16_t)hasbits;
    aStack_48.data = (ulong)CONCAT24(uVar47,aStack_48.data._0_4_) & 0x600ffffffff;
    aVar41.data = 1;
    aStack_60.data = 0x28acaa;
    aVar51 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)msg;
    pvVar20 = MaybeGetSplitBase(msg,true,table);
    ctx = (ParseContext *)aStack_50;
    if ((uVar47 & 0x1c0) == 0x140) {
      aVar43.data = (long)pvVar20 + (ulong)*(uint *)aVar44;
      if ((aVar43.data & 7) != 0) goto LAB_0028afcd;
      if (aStack_58._0_1_ != '\0') {
        *(undefined8 *)aVar43 = 0;
      }
      aVar41 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)(msg->_internal_metadata_).ptr_;
      if ((aVar41.data & 1) != 0) {
        aVar41 = *(anon_union_8_1_898a9ca8_for_TcFieldData_0 *)(aVar41.data & 0xfffffffffffffffe);
      }
      uVar11 = (uint)*(byte *)aVar30;
      aStack_40 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)msg;
      if ((char)*(byte *)aVar30 < '\0') {
        aStack_60 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x28adf2;
        pVar57 = ReadSizeFallback((char *)aVar30,uVar11);
        pcVar13 = pVar57.first;
        uVar11 = pVar57.second;
      }
      else {
        pcVar13 = (char *)(aVar30.data + 1);
      }
      aVar30 = aStack_50;
      if (pcVar13 == (char *)0x0) {
        aVar51.data = 0;
      }
      else {
        aStack_60 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x28ae17;
        aStack_58 = aVar41;
        iVar10 = EpsCopyInputStream::BytesAvailable((EpsCopyInputStream *)aStack_50,pcVar13);
        if (iVar10 < (int)uVar11) {
          aStack_60 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x28ae31;
          aVar51.data = (uint64_t)
                        EpsCopyInputStream::ReadMicroStringFallback
                                  (aVar30.data,pcVar13,uVar11,aVar43.data,aStack_58.data);
        }
        else {
          aStack_60 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x28aea5;
          sVar56._M_str = pcVar13;
          sVar56._M_len = (long)(int)uVar11;
          MicroString::SetImpl((MicroString *)aVar43,sVar56,(Arena *)aStack_58,7);
          aVar51.data = (long)pcVar13 + (long)(int)uVar11;
        }
      }
      aStack_60 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x28aeb3;
      sVar56 = MicroString::Get((MicroString *)aVar43);
      aVar41.data = (uint64_t)sVar56._M_str;
      aStack_60.data = 0x28aeca;
      wire_bytes_01._M_str = (char *)table;
      wire_bytes_01._M_len = aVar41.data;
      bVar8 = MpVerifyUtf8((TcParser *)sVar56._M_len,wire_bytes_01,(TcParseTableBase *)aVar44,
                           (FieldEntry *)(aStack_48.data >> 0x20 & 0xffff),uVar45);
      pPVar29 = extraout_RDX_10;
      msg = (MessageLite *)aStack_40;
      ctx = (ParseContext *)aStack_50;
    }
    else if ((uVar47 & 0x1c0) == 0x80) {
      if (uVar31 == 0x30) {
        if (aStack_58._0_1_ == '\0') {
          aVar51.data = (long)&msg->_vptr_MessageLite + (ulong)*(uint *)aVar44;
          aVar43.data = aVar51.data;
          if ((aVar51.data & 7) != 0) goto LAB_0028afcd;
          aVar43.data = *aVar51.data;
        }
        else {
          pAVar40 = (Arena *)(msg->_internal_metadata_).ptr_;
          if (((ulong)pAVar40 & 1) != 0) {
            pAVar40 = *(Arena **)((ulong)pAVar40 & 0xfffffffffffffffe);
          }
          if (pAVar40 == (Arena *)0x0) {
            aStack_60.data = 0x28b01f;
            aVar21 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)operator_new(0x10);
          }
          else {
            UNRECOVERED_JUMPTABLE_00 = cleanup::arena_destruct_object<absl::lts_20250127::Cord>;
            aVar41.data = 0x10;
            aStack_60.data = 0x28ad6b;
            aVar21 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
                     Arena::AllocateAlignedWithCleanup
                               (pAVar40,0x10,8,
                                cleanup::arena_destruct_object<absl::lts_20250127::Cord>);
          }
          *(undefined8 *)aVar21 = 0;
          *(char **)(aVar21.data + 8) = (char *)0x0;
          aVar51.data = (long)&msg->_vptr_MessageLite + (ulong)*(uint *)aVar44;
          aVar43.data = aVar51.data;
          if ((aVar51.data & 7) != 0) {
LAB_0028afcd:
            aStack_60 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x28afd2;
            AlignFail(aVar43.data);
          }
          *(anon_union_8_1_898a9ca8_for_TcFieldData_0 *)aVar51 = aVar21;
          aVar43 = aVar21;
        }
      }
      else {
        aVar43.data = (long)pvVar20 + (ulong)*(uint *)aVar44;
        if ((aVar43.data & 7) != 0) goto LAB_0028afcd;
      }
      bVar1 = *(byte *)aVar30;
      if ((char)bVar1 < '\0') {
        aVar41.data._4_4_ = 0;
        aVar41.data._0_4_ = CONCAT31(0,bVar1);
        aStack_60.data = 0x28af0c;
        pVar57 = ReadSizeFallback((char *)aVar30,CONCAT31(0,bVar1));
        aVar44 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)UNRECOVERED_JUMPTABLE_00;
      }
      else {
        pVar57.second._0_1_ = bVar1;
        pVar57.first = (undefined1 *)(aVar30.data + 1);
        pVar57._9_7_ = 0;
        aVar44 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)UNRECOVERED_JUMPTABLE_00;
        aVar30 = aVar51;
      }
      pPVar29 = pVar57._8_8_;
      aVar21.data = (uint64_t)pVar57.first;
      if ((EpsCopyInputStream *)aVar21.data == (EpsCopyInputStream *)0x0) {
        aVar51.data = 0;
      }
      else {
        aStack_60.data = 0x28af25;
        aVar30 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)ctx;
        aVar51.data = (uint64_t)
                      EpsCopyInputStream::ReadCord
                                (&ctx->super_EpsCopyInputStream,(char *)aVar21,pVar57.second,
                                 aVar43.data);
        aVar44 = aVar43;
        pPVar29 = extraout_RDX_11;
        aVar41 = aVar21;
      }
      bVar8 = (EpsCopyInputStream *)aVar51.data != (EpsCopyInputStream *)0x0;
      if (bVar8) {
        aVar44.data._2_6_ = 0;
        aVar44.data._0_2_ = aStack_48.data._4_2_;
        aStack_60.data = 0x28af3f;
        MpVerifyUtf8((Cord *)aVar30,(TcParseTableBase *)aVar41,(FieldEntry *)pPVar29,
                     aStack_48.data._4_2_);
        bVar8 = true;
        pPVar29 = extraout_RDX_12;
      }
    }
    else {
      if ((uVar47 & 0x1c0) != 0) {
        aStack_60 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)&UNK_0028b04d;
        Unreachable("/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc"
                    ,0x967);
      }
      aVar41.data = (long)pvVar20 + (ulong)*(uint *)aVar44;
      aVar43.data = aVar41.data;
      if ((aVar41.data & 7) != 0) goto LAB_0028afcd;
      if (aStack_58._0_1_ != '\0') {
        *(undefined8 **)aVar41 = &fixed_address_empty_string;
      }
      aVar43 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)(msg->_internal_metadata_).ptr_;
      if ((aVar43.data & 1) != 0) {
        aVar43 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
                 ((anon_union_8_1_898a9ca8_for_TcFieldData_0 *)(aVar43.data & 0xfffffffffffffffe))->
                 data;
      }
      if (aVar43.data == 0) {
        aStack_60 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x28ae4b;
        psVar16 = ArenaStringPtr::MutableNoCopy_abi_cxx11_((ArenaStringPtr *)aVar41,(Arena *)0x0);
        aStack_60 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x28ae59;
        aVar51.data = (uint64_t)InlineGreedyStringParser(psVar16,aVar30.data,ctx);
      }
      else {
        aStack_60 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x28ad1c;
        aVar51.data = (uint64_t)
                      EpsCopyInputStream::ReadArenaString
                                (aStack_50.data,aVar30.data,aVar41.data,aVar43.data);
      }
      if ((EpsCopyInputStream *)aVar51.data == (EpsCopyInputStream *)0x0) {
        aStack_60.data = 0x28affa;
        anon_unknown_105::EnsureArenaStringIsNotDefault(msg,(ArenaStringPtr *)aVar41);
        bVar8 = false;
        aVar44 = aVar43;
        pPVar29 = extraout_RDX_13;
      }
      else {
        uVar23 = *(ulong *)aVar41;
        aVar41 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
                 ((anon_union_8_1_898a9ca8_for_TcFieldData_0 *)(uVar23 & 0xfffffffffffffffc))->data;
        aStack_60.data = 0x28ae85;
        wire_bytes_00._M_str = (char *)table;
        wire_bytes_00._M_len = aVar41.data;
        bVar8 = MpVerifyUtf8((TcParser *)
                             ((anon_union_8_1_898a9ca8_for_TcFieldData_0 *)
                             (uVar23 & 0xfffffffffffffffc))[1],wire_bytes_00,
                             (TcParseTableBase *)aVar44,
                             (FieldEntry *)(aStack_48.data >> 0x20 & 0xffff),uVar45);
        pPVar29 = extraout_RDX_09;
      }
    }
    aVar30 = aVar51;
    if ((bVar8 == false) || ((EpsCopyInputStream *)aVar30.data == (EpsCopyInputStream *)0x0)) {
      pcVar13 = Error(msg,(char *)aVar41,pPVar29,(TcFieldData)aVar44,table,aStack_38.data);
      return pcVar13;
    }
    if (*(EpsCopyInputStream **)ctx <= aVar30.data) {
      if ((ulong)table->has_bits_offset != 0) {
        puVar22 = (uint *)((long)msg + (ulong)table->has_bits_offset);
        if (((ulong)puVar22 & 3) != 0) {
          aStack_60 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x28b009;
          AlignFail(puVar22);
        }
        *puVar22 = *puVar22 | (uint)aStack_38.data;
      }
      return (char *)aVar30.data;
    }
    uVar11 = (uint)table->fast_idx_mask & (uint)*(ushort *)aVar30;
    if ((uVar11 & 7) != 0) {
      aStack_60 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x28b03c;
      protobuf_assumption_failed
                ("(idx & 7) == 0",
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_impl.h"
                 ,0x452);
    }
    uVar23 = (ulong)(uVar11 & 0xfffffff8);
    UNRECOVERED_JUMPTABLE_00 =
         (code *)((ulong)*(ushort *)aVar30 ^ *(ulong *)(&table[1].fast_idx_mask + uVar23 * 2));
    UNRECOVERED_JUMPTABLE_01 = *(TailCallParseFunc *)(&table[1].has_bits_offset + uVar23);
    hasbits = aStack_38.data;
LAB_0028ac18:
    pcVar13 = (*UNRECOVERED_JUMPTABLE_01)
                        (msg,(char *)aVar30,ctx,(TcFieldData)UNRECOVERED_JUMPTABLE_00,table,hasbits)
    ;
    return pcVar13;
  case 0xe:
    pFVar49 = (FieldEntry *)((long)&table->has_bits_offset + (ulong)aVar38._0_4_);
    pFVar12 = pFVar49;
    if (((ulong)pFVar49 & 3) != 0) {
LAB_0028b393:
      aStack_70 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x28b398;
      AlignFail(pFVar12);
    }
    uVar47 = pFVar49->type_card;
    uVar31 = uVar47 & 0x30;
    if (uVar31 == 0x20) {
      if ((uVar47 & 0x1c0) == 0x40) {
        pcVar13 = MpRepeatedMessageOrGroup<true,true>
                            (msg,(char *)aVar30,ctx,(TcFieldData)UNRECOVERED_JUMPTABLE_00,table,
                             hasbits);
        return pcVar13;
      }
      if ((uVar47 & 0x1c0) == 0) {
        pcVar13 = MpRepeatedMessageOrGroup<true,false>
                            (msg,(char *)aVar30,ctx,(TcFieldData)UNRECOVERED_JUMPTABLE_00,table,
                             hasbits);
        return pcVar13;
      }
LAB_0028b146:
      pcVar13 = (*table->fallback)(msg,(char *)aVar30,ctx,(TcFieldData)UNRECOVERED_JUMPTABLE_00,
                                   table,hasbits);
      return pcVar13;
    }
    if ((uVar47 & 0x1c0) == 0x40) {
      if ((uVar35 & 7) != 3) goto LAB_0028b146;
    }
    else if (((uVar47 & 0x1c0) != 0) || ((uVar35 & 7) != 2)) goto LAB_0028b146;
    aStack_50 = aVar30;
    aStack_38 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)UNRECOVERED_JUMPTABLE_00;
    if (uVar31 == 0x30) {
      aStack_70 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x28b176;
      aStack_60 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)ctx;
      bVar8 = ChangeOneof(table,pFVar49,uVar35 >> 3,(ParseContext *)UNRECOVERED_JUMPTABLE_00,msg);
      aStack_58.data._4_4_ = (int)CONCAT71(extraout_var_01,bVar8);
    }
    else {
      if (uVar31 == 0x10) {
        pFVar12 = (FieldEntry *)
                  ((long)&msg->_vptr_MessageLite + (ulong)((uint)pFVar49->has_idx >> 5) * 4);
        aStack_60 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)ctx;
        if (((ulong)pFVar12 & 3) != 0) goto LAB_0028b393;
        pFVar12->offset = pFVar12->offset | 1 << ((byte)pFVar49->has_idx & 0x1f);
      }
      aStack_58.data = aStack_58.data & 0xffffffff;
      aStack_60 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)ctx;
    }
    aStack_70 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x28b18a;
    pvVar20 = MaybeGetSplitBase(msg,true,table);
    if ((ulong)table->has_bits_offset != 0) {
      pFVar12 = (FieldEntry *)((long)&msg->_vptr_MessageLite + (ulong)table->has_bits_offset);
      if (((ulong)pFVar12 & 3) != 0) goto LAB_0028b393;
      pFVar12->offset = pFVar12->offset | uVar11;
    }
    plVar28 = (long *)((long)pvVar20 + (ulong)pFVar49->offset);
    if (((ulong)plVar28 & 7) != 0) {
      aStack_70 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x28b3a0;
      AlignFail(plVar28);
    }
    pTVar19 = *(TcParseTableBase **)
               ((long)&table->has_bits_offset +
               (ulong)pFVar49->aux_idx * 8 + (ulong)table->aux_offset);
    uVar52 = uVar47 >> 9 & 3;
    if ((short)uVar52 != 2) {
      if ((uVar47 >> 9 & 3) == 0) {
        pcVar18 = 
        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc"
        ;
        pcVar13 = "tv == field_layout::kTvDefault || tv == field_layout::kTvWeakPtr";
        iVar10 = 0x9c8;
        goto LAB_0028b3f6;
      }
      if (uVar52 != 1) {
        pTVar19 = *(TcParseTableBase **)pTVar19;
      }
      aStack_70 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x28b3ba;
      pTVar19 = MessageLite::GetTcParseTable((MessageLite *)pTVar19);
    }
    if ((byte)((byte)((ulong)aStack_58 >> 0x20) | *plVar28 == 0) == 1) {
      pAVar40 = (Arena *)(msg->_internal_metadata_).ptr_;
      if (((ulong)pAVar40 & 1) != 0) {
        pAVar40 = *(Arena **)((ulong)pAVar40 & 0xfffffffffffffffe);
      }
      aStack_70 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x28b20d;
      pMVar17 = ClassData::New(pTVar19->class_data,pAVar40);
      *plVar28 = (long)pMVar17;
    }
    if ((uVar47 & 0x1c0) == 0x40) {
      iVar10 = *(int *)(aStack_60.data + 0x58);
      lVar14 = (long)iVar10 + -1;
      iVar48 = (int)lVar14;
      *(int *)(aStack_60.data + 0x58) = iVar48;
      if ((long)iVar10 < 1) {
        return (char *)0x0;
      }
      lVar50 = (long)*(int *)(aStack_60.data + 0x5c) + 1;
      iVar10 = (int)lVar50;
      *(int *)(aStack_60.data + 0x5c) = iVar10;
      aStack_70 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x28b25a;
      pcVar18 = ParseLoopPreserveNone
                          ((MessageLite *)*plVar28,(char *)aStack_50,(ParseContext *)aStack_60,
                           pTVar19);
      uVar3 = (uint32_t)aStack_38.data;
      if (pcVar18 == (char *)0x0) {
LAB_0028b29c:
        *(int *)(aStack_60.data + 0x5c) = *(int *)(aStack_60.data + 0x5c) + -1;
        *(int *)&((EpsCopyInputStream *)(aStack_60.data + 0x58))->limit_end_ =
             *(int *)&((EpsCopyInputStream *)(aStack_60.data + 0x58))->limit_end_ + 1;
        uVar5 = *(uint32_t *)(aStack_60.data + 0x50);
        *(uint32_t *)(aStack_60.data + 0x50) = 0;
        if (uVar5 == uVar3) {
          return pcVar18;
        }
        return (char *)0x0;
      }
      iVar4 = *(int *)&((EpsCopyInputStream *)(aStack_60.data + 0x58))->limit_end_;
      if (iVar48 == iVar4) {
        pcVar13 = (Nonnull<const_char_*>)0x0;
      }
      else {
        aStack_70 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x28b415;
        pcVar13 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                            (lVar14,(long)iVar4,"old_depth == depth_");
      }
      if (pcVar13 == (Nonnull<const_char_*>)0x0) {
        if (iVar10 == *(int *)(aStack_60.data + 0x5c)) {
          pcVar13 = (Nonnull<const_char_*>)0x0;
        }
        else {
          aStack_70 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x28b44d;
          pcVar13 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                              (lVar50,(long)*(int *)(aStack_60.data + 0x5c),
                               "old_group_depth == group_depth_");
        }
        if (pcVar13 == (Nonnull<const_char_*>)0x0) goto LAB_0028b29c;
        iVar10 = 0x492;
      }
      else {
        iVar10 = 0x491;
      }
    }
    else {
      if ((char)*(byte *)aStack_50 < '\0') {
        aStack_70 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x28b2d3;
        pVar57 = ReadSizeFallback((char *)aStack_50,(uint)*(byte *)aStack_50);
        pcVar13 = pVar57.first;
      }
      else {
        pcVar13 = (char *)(aStack_50.data + 1);
      }
      if ((pcVar13 == (char *)0x0) || (*(int *)(aStack_60.data + 0x58) < 1)) {
        pcVar13 = (char *)0x0;
      }
      else {
        aStack_70 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x28b301;
        EpsCopyInputStream::PushLimit
                  ((EpsCopyInputStream *)&aStack_48,(char *)aStack_60,(int)pcVar13);
        *(int *)(aStack_60.data + 0x58) = *(int *)(aStack_60.data + 0x58) + -1;
        uVar52 = aStack_48.data._0_4_;
      }
      if (pcVar13 == (char *)0x0) {
        return (char *)0x0;
      }
      iVar10 = *(int *)(aStack_60.data + 0x58);
      aStack_70 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x28b332;
      pcVar18 = ParseLoopPreserveNone
                          ((MessageLite *)*plVar28,pcVar13,(ParseContext *)aStack_60,pTVar19);
      if (pcVar18 == (char *)0x0) {
LAB_0028b356:
        *(int *)&((EpsCopyInputStream *)(aStack_60.data + 0x58))->limit_end_ =
             *(int *)&((EpsCopyInputStream *)(aStack_60.data + 0x58))->limit_end_ + 1;
        uVar11 = uVar52 + *(int *)(aStack_60.data + 0x1c);
        *(uint *)(aStack_60.data + 0x1c) = uVar11;
        if (*(uint32_t *)(aStack_60.data + 0x50) != 0) {
          return (char *)0x0;
        }
        *(char **)aStack_60 = *(char **)(aStack_60.data + 8) + (int)((int)uVar11 >> 0x1f & uVar11);
        return pcVar18;
      }
      iVar48 = *(int *)&((EpsCopyInputStream *)(aStack_60.data + 0x58))->limit_end_;
      if (iVar10 == iVar48) {
        pcVar13 = (Nonnull<const_char_*>)0x0;
      }
      else {
        aStack_70 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x28b431;
        pcVar13 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                            ((long)iVar10,(long)iVar48,"old_depth == depth_");
      }
      if (pcVar13 == (Nonnull<const_char_*>)0x0) goto LAB_0028b356;
      iVar10 = 0x481;
    }
    pcVar18 = 
    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/parse_context.h"
    ;
LAB_0028b3f6:
    aStack_70 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x28b3fb;
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&aStack_48,pcVar18,iVar10,pcVar13);
    aStack_70 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x28b403;
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&aStack_48);
  case 0xf:
    aVar41.data = (long)&table->has_bits_offset + (ulong)aVar38._0_4_;
    if ((aVar41.data & 3) != 0) {
      AlignFail(aVar41.data);
    }
    aStack_88.data =
         (long)&table->has_bits_offset +
         (ulong)*(ushort *)(aVar41.data + 8) * 8 + (ulong)table->aux_offset;
    bStack_a9 = *(byte *)(aStack_88.data + 4);
    if (((bStack_a9 & 1) == 0) || ((uVar35 & 7) != 2)) {
      pcVar13 = MpFallback(msg,(char *)aVar30,ctx,(TcFieldData)UNRECOVERED_JUMPTABLE_00,table,
                           hasbits);
      return pcVar13;
    }
    uVar52 = *(undefined4 *)
              ((long)&table->has_bits_offset +
              (ulong)*(ushort *)(aVar41.data + 8) * 8 + (ulong)table->aux_offset);
    pvVar20 = MaybeGetSplitBase(msg,true,table);
    aVar51.data = (ulong)*(uint *)aVar41 + (long)pvVar20;
    aStack_50.data = aVar41.data;
    if ((bStack_a9 & 2) == 0) {
      if ((aVar51.data & 7) != 0) {
LAB_0028b9f4:
        AlignFail(aVar51.data);
      }
      if ((*(ulong *)aVar51 & 1) != 0) {
        (*MapFieldBaseForParse::sync_map_with_repeated)(aVar51.data,1);
      }
      aVar51.data = aVar51.data + 0x10;
    }
    else if ((aVar51.data & 7) != 0) goto LAB_0028b9f4;
    aStack_58.data._4_1_ = bStack_a9;
    aStack_58.data._0_4_ = uVar52;
    aStack_58.data._5_3_ = 0;
    goto LAB_0028b57f;
  }
  aVar44.data = (long)&table->has_bits_offset + (ulong)aVar38._0_4_;
  if ((aVar44.data & 3) != 0) {
    aStack_60 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x2895d8;
    AlignFail(aVar44.data);
  }
  if ((uVar35 & 7) != 2) {
    UNRECOVERED_JUMPTABLE_01 = table->fallback;
    goto LAB_0028929e;
  }
  uVar47 = *(ushort *)(aVar44.data + 10);
  uVar31 = uVar47 & 0x30;
  if (uVar31 == 0x20) {
    pcVar13 = MpRepeatedString<false>
                        (msg,(char *)aVar30,ctx,(TcFieldData)UNRECOVERED_JUMPTABLE_00,table,hasbits)
    ;
    return pcVar13;
  }
  if (uVar31 == 0x10) {
    aVar41.data = (long)&msg->_vptr_MessageLite + (ulong)(*(uint *)(aVar44.data + 4) >> 5) * 4;
    if ((aVar41.data & 3) != 0) {
      aStack_60 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x2895f6;
      aStack_50 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)ctx;
      aStack_38.data = hasbits;
      AlignFail();
    }
    *(uint *)aVar41 = *(uint *)aVar41 | 1 << ((byte)*(uint *)(aVar44.data + 4) & 0x1f);
LAB_00289308:
    bVar8 = false;
    aVar34 = aVar30;
    aStack_50 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)ctx;
    aStack_38.data = hasbits;
  }
  else {
    aVar41 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)msg;
    if (uVar31 != 0x30) goto LAB_00289308;
    aStack_60.data = 0x289301;
    aVar34.data = aVar44.data;
    aVar41 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)table;
    aStack_50 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)ctx;
    aStack_38.data = hasbits;
    bVar8 = ChangeOneof(table,(FieldEntry *)aVar44,uVar35 >> 3,(ParseContext *)(ulong)(uVar35 >> 3),
                        msg);
  }
  aVar51 = aStack_50;
  uVar45 = (uint16_t)hasbits;
  arena._0_4_ = uVar47 & 0x600;
  arena._4_4_ = 0;
  aStack_58.data = (ulong)CONCAT24(uVar47,aStack_58._0_4_) & 0x600ffffffff;
  if ((uVar47 & 0x1c0) == 0x140) {
    aVar41.data = (long)&msg->_vptr_MessageLite + (ulong)*(uint *)aVar44;
    if ((aVar41.data & 7) != 0) goto LAB_002895f9;
    if (bVar8 != false) {
      *(uint64_t *)aVar41 = 0;
    }
    aStack_48 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)(msg->_internal_metadata_).ptr_;
    if ((aStack_48.data & 1) != 0) {
      aStack_48 = *(anon_union_8_1_898a9ca8_for_TcFieldData_0 *)
                   (aStack_48.data & 0xfffffffffffffffe);
    }
    bVar1 = *(byte *)aVar30;
    uVar11 = (uint)bVar1;
    if ((char)bVar1 < '\0') {
      aStack_60 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x289440;
      pVar57 = ReadSizeFallback((char *)aVar30,(uint)bVar1);
      pcVar13 = pVar57.first;
      uVar11 = pVar57.second;
    }
    else {
      pcVar13 = (char *)(aVar30.data + 1);
    }
    aVar30 = aStack_50;
    if (pcVar13 == (char *)0x0) {
      aVar51.data = 0;
    }
    else {
      aStack_60 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x289462;
      aStack_40.data = aVar41.data;
      iVar10 = EpsCopyInputStream::BytesAvailable((EpsCopyInputStream *)aStack_50,pcVar13);
      aVar41 = aStack_40;
      if (iVar10 < (int)uVar11) {
        aStack_60 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x289480;
        aVar51.data = (uint64_t)
                      EpsCopyInputStream::ReadMicroStringFallback
                                (aVar30.data,pcVar13,uVar11,aStack_40.data,aStack_48.data);
      }
      else {
        aStack_60 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x2894e8;
        data_00._M_str = pcVar13;
        data_00._M_len = (long)(int)uVar11;
        MicroString::SetImpl((MicroString *)aStack_40,data_00,(Arena *)aStack_48,7);
        aVar51.data = (long)pcVar13 + (long)(int)uVar11;
      }
    }
    aStack_60 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x2894f3;
    sVar53 = MicroString::Get((MicroString *)aVar41);
LAB_002894ff:
    wire_bytes._M_len = (uint64_t)sVar53._M_str;
    aStack_60.data = 0x28950a;
    wire_bytes._M_str = (char *)table;
    bVar8 = MpVerifyUtf8((TcParser *)sVar53._M_len,wire_bytes,(TcParseTableBase *)aVar44,
                         (FieldEntry *)(ulong)(ushort)aStack_58.data._4_2_,uVar45);
    arena = (code *)aVar44;
  }
  else if ((uVar47 & 0x1c0) == 0x80) {
    if (uVar31 == 0x30) {
      if (bVar8 == false) {
        aVar41.data = (long)&msg->_vptr_MessageLite + (ulong)*(uint *)aVar44;
        if ((aVar41.data & 7) != 0) goto LAB_002895f9;
        wire_bytes._M_len = *aVar41.data;
      }
      else {
        pAVar40 = (Arena *)(msg->_internal_metadata_).ptr_;
        if (((ulong)pAVar40 & 1) != 0) {
          pAVar40 = *(Arena **)((ulong)pAVar40 & 0xfffffffffffffffe);
        }
        if (pAVar40 == (Arena *)0x0) {
          aStack_60.data = 0x289646;
          wire_bytes._M_len = (anon_union_8_1_898a9ca8_for_TcFieldData_0)operator_new(0x10);
        }
        else {
          arena = cleanup::arena_destruct_object<absl::lts_20250127::Cord>;
          aVar34.data = 0x10;
          aStack_60.data = 0x2893c2;
          wire_bytes._M_len =
               (anon_union_8_1_898a9ca8_for_TcFieldData_0)
               Arena::AllocateAlignedWithCleanup
                         (pAVar40,0x10,8,cleanup::arena_destruct_object<absl::lts_20250127::Cord>);
        }
        *(undefined8 *)wire_bytes._M_len = 0;
        *(char **)(wire_bytes._M_len + 8) = (char *)0x0;
        aVar41.data = (long)&msg->_vptr_MessageLite + (ulong)*(uint *)aVar44;
        if ((aVar41.data & 7) != 0) {
LAB_002895f9:
          aStack_60 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x2895fe;
          AlignFail(aVar41.data);
        }
        *(anon_union_8_1_898a9ca8_for_TcFieldData_0 *)aVar41 = (uint64_t)wire_bytes._M_len;
      }
    }
    else {
      wire_bytes._M_len = (long)&msg->_vptr_MessageLite + (ulong)*(uint *)aVar44;
      if ((wire_bytes._M_len & 7) != 0) goto LAB_0028942e;
    }
    bVar1 = *(byte *)aVar30;
    if ((char)bVar1 < '\0') {
      aVar34.data._4_4_ = 0;
      aVar34.data._0_4_ = CONCAT31(0,bVar1);
      aStack_60.data = 0x289537;
      pVar54 = ReadSizeFallback((char *)aVar30,CONCAT31(0,bVar1));
    }
    else {
      pVar54.second._0_1_ = bVar1;
      pVar54.first = (undefined1 *)(aVar30.data + 1);
      pVar54._9_7_ = 0;
      aVar30 = aVar41;
    }
    entry = pVar54._8_8_;
    aVar44.data = (uint64_t)pVar54.first;
    if ((EpsCopyInputStream *)aVar44.data == (EpsCopyInputStream *)0x0) {
      aVar51.data = 0;
      wire_bytes._M_len = aVar34;
    }
    else {
      aStack_60.data = 0x28954f;
      aVar30 = aStack_50;
      aVar51.data = (uint64_t)
                    EpsCopyInputStream::ReadCord
                              (aStack_50.data,(char *)aVar44,pVar54.second,wire_bytes._M_len);
      arena = (code *)wire_bytes._M_len;
      entry = extraout_RDX_01;
      wire_bytes._M_len = aVar44;
    }
    bVar8 = (EpsCopyInputStream *)aVar51.data != (EpsCopyInputStream *)0x0;
    if (bVar8) {
      arena._2_6_ = 0;
      arena._0_2_ = aStack_58._4_2_;
      aStack_60.data = 0x289569;
      MpVerifyUtf8((Cord *)aVar30,(TcParseTableBase *)wire_bytes._M_len,entry,aStack_58._4_2_);
      bVar8 = true;
    }
  }
  else {
    if ((uVar47 & 0x1c0) != 0) {
      aStack_60.data = (uint64_t)MpMessage<false>;
      Unreachable("/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc"
                  ,0x967);
    }
    wire_bytes._M_len = (long)&msg->_vptr_MessageLite + (ulong)*(uint *)aVar44;
    if ((wire_bytes._M_len & 7) != 0) {
LAB_0028942e:
      aStack_60 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x289436;
      AlignFail(wire_bytes._M_len);
    }
    if (bVar8 != false) {
      *(undefined8 **)wire_bytes._M_len = &fixed_address_empty_string;
    }
    arena = (code *)(msg->_internal_metadata_).ptr_;
    if (((ulong)arena & 1) != 0) {
      arena = (code *)((anon_union_8_1_898a9ca8_for_TcFieldData_0 *)
                      ((ulong)arena & 0xfffffffffffffffe))->data;
    }
    if (arena == (code *)0x0) {
      aStack_60 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x289497;
      psVar16 = ArenaStringPtr::MutableNoCopy_abi_cxx11_
                          ((ArenaStringPtr *)wire_bytes._M_len,(Arena *)0x0);
      aStack_60 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x2894a5;
      aVar51.data = (uint64_t)InlineGreedyStringParser(psVar16,aVar30.data,aVar51.data);
    }
    else {
      aStack_60 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x28937e;
      aVar51.data = (uint64_t)
                    EpsCopyInputStream::ReadArenaString
                              (aStack_50.data,aVar30.data,wire_bytes._M_len,(Arena *)arena);
    }
    if ((EpsCopyInputStream *)aVar51.data != (EpsCopyInputStream *)0x0) {
      sVar53._M_str = *(char **)(*(ulong *)wire_bytes._M_len & 0xfffffffffffffffc);
      sVar53._M_len = ((undefined8 *)(*(ulong *)wire_bytes._M_len & 0xfffffffffffffffc))[1];
      goto LAB_002894ff;
    }
    aStack_60.data = 0x289621;
    anon_unknown_105::EnsureArenaStringIsNotDefault(msg,(ArenaStringPtr *)wire_bytes._M_len);
    bVar8 = false;
  }
  if ((bVar8 == false) || ((EpsCopyInputStream *)aVar51.data == (EpsCopyInputStream *)0x0)) {
    pcVar13 = Error(msg,(char *)wire_bytes._M_len,(ParseContext *)aStack_50,(TcFieldData)arena,table
                    ,aStack_38.data);
    return pcVar13;
  }
  if (*(EpsCopyInputStream **)aStack_50 <= aVar51.data) {
    if ((ulong)table->has_bits_offset != 0) {
      puVar22 = (uint *)((long)&msg->_vptr_MessageLite + (ulong)table->has_bits_offset);
      if (((ulong)puVar22 & 3) != 0) {
        aStack_60 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x289630;
        AlignFail(puVar22);
      }
      *puVar22 = *puVar22 | (uint)aStack_38.data;
    }
    return (char *)aVar51.data;
  }
  uVar11 = (uint)table->fast_idx_mask & (uint)*(ushort *)aVar51;
  if ((uVar11 & 7) != 0) {
    aStack_60 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x289663;
    protobuf_assumption_failed
              ("(idx & 7) == 0",
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_impl.h"
               ,0x452);
  }
  uVar23 = (ulong)(uVar11 & 0xfffffff8);
  UNRECOVERED_JUMPTABLE_00 =
       (code *)((ulong)*(ushort *)aVar51 ^ *(ulong *)(&table[1].fast_idx_mask + uVar23 * 2));
  UNRECOVERED_JUMPTABLE_01 = *(TailCallParseFunc *)(&table[1].has_bits_offset + uVar23);
  ctx = (ParseContext *)aStack_50;
  hasbits = aStack_38.data;
  aVar30 = aVar51;
LAB_0028929e:
  pcVar13 = (*UNRECOVERED_JUMPTABLE_01)
                      (msg,(char *)aVar30,ctx,(TcFieldData)UNRECOVERED_JUMPTABLE_00,table,hasbits);
  return pcVar13;
code_r0x0028b750:
  aVar38._0_4_ = (uint)pcVar18 & 0xf;
  puVar22 = &switchD_0028b761::switchdataD_0045a90c;
  uVar23 = (ulong)(int)(&switchD_0028b761::switchdataD_0045a90c)[aVar38._0_4_];
  UNRECOVERED_JUMPTABLE_00 = (code *)((long)&switchD_0028b761::switchdataD_0045a90c + uVar23);
  switch(aVar38._0_4_) {
  case 0:
    KeyMapBase<bool>::InsertOrReplaceNode((KeyMapBase<bool> *)aVar51,(KeyNode *)aVar21);
    break;
  case 1:
    KeyMapBase<unsigned_int>::InsertOrReplaceNode
              ((KeyMapBase<unsigned_int> *)aVar51,(KeyNode *)aVar21);
    break;
  case 2:
switchD_0028b761_caseD_2:
    KeyMapBase<unsigned_long>::InsertOrReplaceNode
              ((KeyMapBase<unsigned_long> *)aVar51,(KeyNode *)aVar21);
    break;
  default:
    goto switchD_0028b761_caseD_3;
  case 5:
    aVar30 = aVar51;
code_r0x0028b780:
    KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    InsertOrReplaceNode((KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)aVar30,(KeyNode *)aVar21);
    break;
  case 6:
    pcVar13 = (char *)(*UNRECOVERED_JUMPTABLE_00)();
    return pcVar13;
  case 7:
    pcVar13 = MpRepeatedVarintT<false,unsigned_int,(unsigned_short)1536>
                        ((MessageLite *)aVar30,pcVar13,pPVar29,(TcFieldData)0x45a90c,
                         (TcParseTableBase *)aVar44,aVar34.data);
    return pcVar13;
  case 8:
    aVar21 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)puVar22;
    ctx_00 = pPVar29;
    ctx = (ParseContext *)pcVar13;
    aVar41 = aVar30;
    aVar51 = aVar44;
code_r0x0028bbe6:
    pcVar13 = MpRepeatedVarintT<false,unsigned_long,(unsigned_short)512>
                        ((MessageLite *)aVar41,(char *)ctx,ctx_00,(TcFieldData)aVar21,
                         (TcParseTableBase *)aVar51,aVar34.data);
    return pcVar13;
  case 9:
    goto switchD_0028b761_caseD_9;
  case 10:
    halt_baddata();
  case 0xb:
    UNRECOVERED_JUMPTABLE_00 = (code *)(ulong)(*(byte *)(aVar30.data + 0xf) & 0xf);
  case 0xf:
    if (5 < (uint)UNRECOVERED_JUMPTABLE_00) {
      UntypedMapBase::
      VisitKeyType<google::protobuf::internal::UntypedMapBase::VisitKey<absl::lts_20250127::Overload<google::protobuf::internal::TcParser::MpMap<false>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(std::__cxx11::string*)_1_,google::protobuf::internal::TcParser::MpMap<false>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(void*)_1_>>(google::protobuf::internal::NodeBase*,absl::lts_20250127::Overload<google::protobuf::internal::TcParser::MpMap<false>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(std::__cxx11::string*)_1_,google::protobuf::internal::TcParser::MpMap<false>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(void*)_1_>)const::_lambda(auto:1)_1_>
                ();
    }
    puVar22 = &switchD_0028fe78::switchdataD_0045a934;
code_r0x0028fe71:
    pcVar13 = (char *)(*(code *)((long)(int)puVar22[(long)UNRECOVERED_JUMPTABLE_00] + (long)puVar22)
                      )();
    return pcVar13;
  case 0xc:
    if (SCARRY8(uVar23,0x45a90c) != (long)UNRECOVERED_JUMPTABLE_00 < 0) {
      return (char *)wire_bytes._M_len.data;
    }
    pcVar13 = (char *)((long)&UINT_0045a898 + uVar23 + 1);
    *pcVar13 = *pcVar13 + '\f' + (0xffffffffffba56f3 < uVar23);
    UNRECOVERED_JUMPTABLE_00 = (code *)(ulong)((uint)UNRECOVERED_JUMPTABLE_00 | 0x1caac3);
    goto code_r0x0028fe71;
  case 0xd:
  case 0xe:
    *(char *)aVar30 = (char)UNRECOVERED_JUMPTABLE_00;
    UNRECOVERED_JUMPTABLE_00 =
         (code *)CONCAT71((int7)((ulong)UNRECOVERED_JUMPTABLE_00 >> 8),
                          (char)UNRECOVERED_JUMPTABLE_00 - (0xffffffffffba56f3 < uVar23));
    goto code_r0x0028fe71;
  }
  do {
    pPVar29 = (ParseContext *)(ctx->super_EpsCopyInputStream).limit_end_;
    if (pPVar29 <= ctx_00) {
      uVar47 = table->has_bits_offset;
joined_r0x0028b9b7:
      if ((ulong)uVar47 != 0) {
        puVar22 = (uint *)((long)&msg->_vptr_MessageLite + (ulong)uVar47);
        if (((ulong)puVar22 & 3) != 0) {
          AlignFail();
        }
        *puVar22 = *puVar22 | uVar11;
      }
      return (char *)ctx_00;
    }
    bVar1 = *(byte *)&(ctx_00->super_EpsCopyInputStream).limit_end_;
    aVar38._0_4_ = (uint)bVar1;
    aVar30.data = (long)&(ctx_00->super_EpsCopyInputStream).limit_end_ + 1;
    if ((char)bVar1 < '\0') {
      uVar37 = (uint7)(((ulong)bVar1 << 0x39) >> 8);
      lVar14 = CONCAT71(uVar37,*(char *)aVar30);
      if (*(char *)aVar30 < '\0') {
        uVar37 = uVar37 >> 7 | (uint7)((ulong)(lVar14 << 0x39) >> 8);
        cVar2 = *(char *)((long)&(ctx_00->super_EpsCopyInputStream).limit_end_ + 2);
        lVar14 = CONCAT71(uVar37,cVar2);
        if (cVar2 < '\0') {
          uVar37 = uVar37 >> 7 | (uint7)((ulong)(lVar14 << 0x39) >> 8);
          cVar2 = *(char *)((long)&(ctx_00->super_EpsCopyInputStream).limit_end_ + 3);
          lVar14 = CONCAT71(uVar37,cVar2);
          if (cVar2 < '\0') {
            uVar37 = uVar37 >> 7 | (uint7)((ulong)(lVar14 << 0x39) >> 8);
            cVar2 = *(char *)((long)&(ctx_00->super_EpsCopyInputStream).limit_end_ + 4);
            if (cVar2 < '\0') {
              aVar38._0_4_ = 0;
              aVar30.data = 0;
            }
            else {
              aVar38._0_4_ = (int)CONCAT71(uVar37,cVar2) << 0x1c | (uint)(uVar37 >> 0x1c);
              aVar30.data = (long)&(ctx_00->super_EpsCopyInputStream).limit_end_ + 5;
            }
          }
          else {
            aVar38._0_4_ = (int)lVar14 << 0x15 | (uint)(uVar37 >> 0x23);
            aVar30.data = (long)&(ctx_00->super_EpsCopyInputStream).limit_end_ + 4;
          }
        }
        else {
          aVar38._0_4_ = (int)lVar14 << 0xe | (uint)(uVar37 >> 0x2a);
          aVar30.data = (long)&(ctx_00->super_EpsCopyInputStream).limit_end_ + 3;
        }
      }
      else {
        aVar38._0_4_ = (int)lVar14 << 7 | (uint)(((ulong)bVar1 << 0x39) >> 0x39);
        aVar30.data = (long)&(ctx_00->super_EpsCopyInputStream).limit_end_ + 2;
      }
    }
    if (aVar38._0_4_ != uVar35) {
      if (ctx_00 < pPVar29) {
        uVar47 = *(ushort *)&(ctx_00->super_EpsCopyInputStream).limit_end_;
        uVar11 = (uint)table->fast_idx_mask & (uint)uVar47;
        if ((uVar11 & 7) != 0) {
          protobuf_assumption_failed
                    ("(idx & 7) == 0",
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_impl.h"
                     ,0x452);
        }
        uVar23 = (ulong)(uVar11 & 0xfffffff8);
        pcVar13 = (char *)(**(code **)(&table[1].has_bits_offset + uVar23))
                                    (msg,ctx_00,ctx,
                                     (ulong)uVar47 ^
                                     *(ulong *)(&table[1].fast_idx_mask + uVar23 * 2),table,hasbits)
        ;
        return pcVar13;
      }
      uVar47 = table->has_bits_offset;
      goto joined_r0x0028b9b7;
    }
LAB_0028b57f:
    pcVar13._2_6_ = 0;
    pcVar13._0_2_ = *(ushort *)(aVar51.data + 0xc);
    aVar21.data = (uint64_t)UntypedMapBase::AllocNode(aVar51.data,(size_t)pcVar13);
    uVar47 = *(ushort *)(aVar51.data + 0xc);
    uVar23 = (ulong)uVar47 - 8;
    if (uVar23 < 8) {
      pcVar13 = (char *)0x8;
      pcVar24 = absl::lts_20250127::log_internal::MakeCheckOpString<long,unsigned_long>
                          (uVar23,8,"node_end - static_cast<char*>(node_key) >= sizeof(uint64_t)");
    }
    else {
      pcVar24 = (Nonnull<const_char_*>)0x0;
    }
    if (pcVar24 != (Nonnull<const_char_*>)0x0) {
      pcVar13 = 
      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc"
      ;
      aVar34.data = (uint64_t)&aStack_80;
      iVar10 = 0xb2c;
      goto LAB_0028ba44;
    }
    *(char **)(aVar21.data + 8) = (char *)0x0;
    *(undefined8 *)((long)(aVar21.data - 8) + (ulong)uVar47) = 0;
    aVar34.data = (uint64_t)&aStack_48;
    f_01.f = (Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_generated_message_tctable_lite_cc:2866:19),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_generated_message_tctable_lite_cc:2870:19)>
              *)aVar34.data;
    f_01.this = (UntypedMapBase *)aVar51.data;
    f_01.node = (NodeBase **)&aStack_60;
    aStack_80 = aVar51;
    aStack_78.data = aVar34.data;
    aStack_70.data = (uint64_t)&aStack_60;
    aStack_60 = aVar21;
    aStack_48 = aVar51;
    UntypedMapBase::
    VisitKeyType<google::protobuf::internal::UntypedMapBase::VisitKey<absl::lts_20250127::Overload<google::protobuf::internal::TcParser::MpMap<true>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(std::__cxx11::string*)_1_,google::protobuf::internal::TcParser::MpMap<true>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(void*)_1_>>(google::protobuf::internal::NodeBase*,absl::lts_20250127::Overload<google::protobuf::internal::TcParser::MpMap<true>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(std::__cxx11::string*)_1_,google::protobuf::internal::TcParser::MpMap<true>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(void*)_1_>)const::_lambda(auto:1)_1_>
              ((UntypedMapBase *)aVar51,f_01);
    aStack_40.data = (uint64_t)&aStack_88;
    f_02.f = (Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_generated_message_tctable_lite_cc:2875:19),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_generated_message_tctable_lite_cc:2878:19),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_generated_message_tctable_lite_cc:2882:19)>
              *)aVar34.data;
    f_02.this = (UntypedMapBase *)aVar51.data;
    f_02.node = (NodeBase **)&aStack_60;
    aVar41 = aVar51;
    wire_bytes._M_len = aVar51;
    aStack_80 = aVar51;
    aStack_78.data = aVar34.data;
    aStack_70.data = (uint64_t)&aStack_60;
    aStack_60 = aVar21;
    aStack_48 = aVar51;
    aStack_38 = aVar51;
    UntypedMapBase::
    VisitValueType<google::protobuf::internal::UntypedMapBase::VisitValue<absl::lts_20250127::Overload<google::protobuf::internal::TcParser::MpMap<true>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(std::__cxx11::string*)_2_,google::protobuf::internal::TcParser::MpMap<true>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(google::protobuf::MessageLite*)_1_,google::protobuf::internal::TcParser::MpMap<true>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(void*)_2_>>(google::protobuf::internal::NodeBase*,absl::lts_20250127::Overload<google::protobuf::internal::TcParser::MpMap<true>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(std::__cxx11::string*)_2_,google::protobuf::internal::TcParser::MpMap<true>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(google::protobuf::MessageLite*)_1_,google::protobuf::internal::TcParser::MpMap<true>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(void*)_2_>)const::_lambda(auto:1)_1_>
              ((UntypedMapBase *)aVar51,f_02);
    bVar1 = *(byte *)aVar30;
    aVar39.data._1_7_ = 0;
    aVar39.data._0_1_ = bVar1;
    if ((char)bVar1 < '\0') {
      pcVar13._4_4_ = 0;
      pcVar13._0_4_ = CONCAT31(0,bVar1);
      pVar58 = ReadSizeFallback((char *)aVar30,CONCAT31(0,bVar1));
      aVar39.data = pVar58._8_8_ & 0xffffffff;
    }
    else {
      pVar58._8_8_ = extraout_RDX_14;
      pVar58.first = (char *)(aVar30.data + 1);
      aVar30 = aVar41;
    }
    pPVar29 = pVar58._8_8_;
    aVar41.data = (uint64_t)pVar58.first;
    if (((EpsCopyInputStream *)aVar41.data == (EpsCopyInputStream *)0x0) || (ctx->depth_ < 1)) {
      aVar41.data = 0;
    }
    else {
      aVar30.data = (uint64_t)&aStack_80;
      pcVar13 = (char *)ctx;
      EpsCopyInputStream::PushLimit((EpsCopyInputStream *)aVar30,(char *)ctx,(int)pVar58.first);
      auStack_68._4_4_ = aStack_80.data._0_4_;
      ctx->depth_ = ctx->depth_ + -1;
      pPVar29 = extraout_RDX_15;
    }
    if ((EpsCopyInputStream *)aVar41.data == (EpsCopyInputStream *)0x0) {
LAB_0028b6f7:
      ctx_00 = (ParseContext *)0x0;
    }
    else {
      iVar10 = ctx->depth_;
      aVar34 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)(long)iVar10;
      aVar39 = aStack_88;
      aVar30 = aVar21;
      aVar44 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)table;
      wire_bytes._M_len = aVar51;
      ctx_00 = (ParseContext *)
               ParseOneMapEntry((NodeBase *)aVar21,(char *)aVar41,ctx,(FieldAux *)aStack_88,table,
                                (FieldEntry *)aStack_50,(UntypedMapBase *)aVar51);
      pPVar29 = extraout_RDX_16;
      if (ctx_00 != (ParseContext *)0x0) {
        aVar41 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)(long)ctx->depth_;
        if (iVar10 == ctx->depth_) {
          pcVar24 = (Nonnull<const_char_*>)0x0;
        }
        else {
          aVar30 = aVar34;
          pcVar24 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                              (aVar34.data,aVar41.data,"old_depth == depth_");
          pPVar29 = extraout_RDX_17;
        }
        if (pcVar24 != (Nonnull<const_char_*>)0x0) {
          pcVar13 = 
          "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/parse_context.h"
          ;
          aVar34.data = (uint64_t)&aStack_80;
          goto switchD_00289d5e_caseD_9;
        }
      }
      ctx->depth_ = ctx->depth_ + 1;
      aVar38._0_4_ = (ctx->super_EpsCopyInputStream).limit_ + auStack_68._4_4_;
      (ctx->super_EpsCopyInputStream).limit_ = aVar38._0_4_;
      pcVar13 = (char *)aVar41;
      if ((ctx->super_EpsCopyInputStream).last_tag_minus_1_ != 0) goto LAB_0028b6f7;
      aVar39._0_4_ = (int)aVar38._0_4_ >> 0x1f & aVar38._0_4_;
      aVar39.data._4_4_ = 0;
      (ctx->super_EpsCopyInputStream).limit_end_ =
           (ctx->super_EpsCopyInputStream).buffer_end_ + (int)aVar39._0_4_;
    }
    if (ctx_00 == (ParseContext *)0x0) {
      if (*(long *)(aVar51.data + 0x18) == 0) {
        UntypedMapBase::DeleteNode((UntypedMapBase *)aVar51,(NodeBase *)aVar21);
        pPVar29 = extraout_RDX_18;
        pcVar13 = (char *)aVar21;
      }
      pcVar13 = Error(msg,pcVar13,pPVar29,(TcFieldData)aVar39,table,hasbits);
      return pcVar13;
    }
    if ((bStack_a9 & 0x10) == 0) break;
    puVar22 = (uint *)UntypedMapBase::GetValue<int>((UntypedMapBase *)aVar51,(NodeBase *)aVar21);
    aVar38._0_4_ = *puVar22;
    puVar22 = *(uint **)(aStack_88.data + 8);
    pcVar13 = (char *)(long)(short)*puVar22;
    aVar30.data._0_4_ = *puVar22 >> 0x10;
    aVar30.data._4_4_ = 0;
    pPVar29 = (ParseContext *)(((long)(int)aVar38._0_4_ - (long)pcVar13) - (long)aVar30);
    if ((EpsCopyInputStream *)((long)(int)aVar38._0_4_ - (long)pcVar13) < aVar30.data) break;
    uVar25 = puVar22[1];
    pcVar13._4_4_ = 0;
    pcVar13._0_4_ = uVar25;
    aVar30.data._2_6_ = 0;
    aVar30.data._0_2_ = (ushort)uVar25;
    if (pPVar29 < (ulong)aVar30) {
      aVar30.data._1_1_ = (char)(uVar25 >> 8);
      aVar30.data._0_1_ = (puVar22[((ulong)pPVar29 >> 5) + 2] >> ((uint)pPVar29 & 0x1f) & 1) != 0;
      aVar30.data._2_6_ = 0;
    }
    else {
      pPVar29 = (ParseContext *)(ulong)(uVar25 >> 0x10);
      aVar41.data = 0;
      while (pcVar13 = (char *)aVar41, aVar30._1_7_ = (undefined7)((ulong)aVar30 >> 8),
            aVar30.data._0_1_ = pcVar13 < pPVar29, pcVar13 < pPVar29) {
        uVar46 = *(uint *)((long)puVar22 + (long)pcVar13 * 4 + (ulong)(uVar25 >> 3 & 0x1ffc) + 8);
        aVar30.data._4_4_ = 0;
        aVar30.data._0_4_ = uVar46;
        aVar44.data = ((long)pcVar13 * 2 - (ulong)((int)aVar38._0_4_ < (int)uVar46)) + 2;
        aVar41.data = aVar44.data;
        if (uVar46 == aVar38._0_4_) goto LAB_0028b73b;
      }
    }
    if ((char)aVar30.data != '\0') break;
    WriteMapEntryAsUnknown
              (msg,table,(UntypedMapBase *)aVar51,uVar35,(NodeBase *)aVar21,SUB85(aStack_58.data,0))
    ;
    aVar44 = aVar21;
  } while( true );
LAB_0028b73b:
  pcVar18 = (char *)(ulong)(*(uint *)(aVar51.data + 0xc) >> 0x18);
  if (5 < ((byte)(*(uint *)(aVar51.data + 0xc) >> 0x18) & 0xf)) {
switchD_0028b761_caseD_3:
    Unreachable("/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc"
                ,0xb68);
  }
  goto code_r0x0028b750;
switchD_0028b761_caseD_9:
  pcVar13 = MpRepeatedVarintT<false,unsigned_int,(unsigned_short)1024>
                      ((MessageLite *)aVar30,pcVar13,pPVar29,(TcFieldData)puVar22,
                       (TcParseTableBase *)aVar44,aVar34.data);
  return pcVar13;
switchD_00289d5e_caseD_9:
  iVar10 = 0x481;
LAB_0028ba44:
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)aVar34,pcVar13,iVar10,pcVar24);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)aVar34);
}

Assistant:

const char* TcParser::FastEndGroupImpl(PROTOBUF_TC_PARAM_DECL) {
  if (ABSL_PREDICT_FALSE(data.coded_tag<TagType>() != 0)) {
    PROTOBUF_MUSTTAIL return MiniParse(PROTOBUF_TC_PARAM_NO_DATA_PASS);
  }
  ctx->SetLastTag(data.decoded_tag());
  ptr += sizeof(TagType);
  PROTOBUF_MUSTTAIL return ToParseLoop(PROTOBUF_TC_PARAM_NO_DATA_PASS);
}